

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O1

bool embree::avx::ConeCurveMiMBIntersectorK<8,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Scene *pSVar11;
  Geometry *pGVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  float fVar44;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  bool bVar73;
  bool bVar74;
  bool bVar75;
  bool bVar76;
  bool bVar77;
  bool bVar78;
  bool bVar79;
  bool bVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  uint uVar88;
  long lVar89;
  uint uVar90;
  ulong uVar91;
  undefined1 auVar92 [8];
  long lVar93;
  undefined4 uVar94;
  long lVar95;
  ulong uVar96;
  bool bVar97;
  bool bVar98;
  undefined1 auVar99 [16];
  undefined1 auVar101 [32];
  float fVar109;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar116;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar127;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar128;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar168;
  float fVar169;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar181;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  float fVar194;
  float fVar198;
  float fVar199;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar215;
  float fVar216;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar226;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  float fVar236;
  undefined1 auVar229 [64];
  float fVar237;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [64];
  float fVar250;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<8> hit;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  RTCFilterFunctionNArguments local_670;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  Primitive *local_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [32];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined4 uStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  RTCHitN local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined1 auVar100 [32];
  
  pSVar11 = context->scene;
  uVar88 = line->sharedGeomID;
  pGVar12 = (pSVar11->geometries).items[uVar88].ptr;
  fVar250 = (pGVar12->time_range).lower;
  fVar250 = pGVar12->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar250) / ((pGVar12->time_range).upper - fVar250));
  auVar30 = vroundss_avx(ZEXT416((uint)fVar250),ZEXT416((uint)fVar250),9);
  auVar30 = vminss_avx(auVar30,ZEXT416((uint)(pGVar12->fnumTimeSegments + -1.0)));
  auVar30 = vmaxss_avx(ZEXT816(0),auVar30);
  uVar90 = (line->v0).field_0.i[0];
  lVar93 = *(long *)&pGVar12[3].time_range.upper;
  lVar89 = (long)(int)auVar30._0_4_ * 0x38;
  lVar13 = *(long *)(lVar93 + lVar89);
  lVar95 = *(long *)(lVar93 + 0x10 + lVar89);
  uVar4 = (line->v0).field_0.i[1];
  uVar5 = (line->v0).field_0.i[2];
  uVar6 = (line->v0).field_0.i[4];
  puVar1 = (undefined8 *)(lVar13 + lVar95 * (ulong)uVar6);
  uStack_5f0 = *puVar1;
  _local_600 = *(undefined1 (*) [16])(lVar13 + lVar95 * (ulong)uVar90);
  uStack_5e8 = puVar1[1];
  uVar7 = (line->v0).field_0.i[5];
  puVar1 = (undefined8 *)(lVar13 + lVar95 * (ulong)uVar7);
  uStack_6b0 = *puVar1;
  _local_6c0 = *(undefined1 (*) [16])(lVar13 + lVar95 * (ulong)uVar4);
  uStack_6a8 = puVar1[1];
  uVar8 = (line->v0).field_0.i[6];
  auVar110._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar95 * (ulong)uVar8);
  auVar110._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar95 * (ulong)uVar5);
  uVar9 = (line->v0).field_0.i[3];
  uVar10 = (line->v0).field_0.i[7];
  auVar148._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar95 * (ulong)uVar10);
  auVar148._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar95 * (ulong)uVar9);
  puVar1 = (undefined8 *)(lVar13 + lVar95 * (ulong)(uVar6 + 1));
  uStack_5b0 = *puVar1;
  _local_5c0 = *(undefined1 (*) [16])(lVar13 + lVar95 * (ulong)(uVar90 + 1));
  uStack_5a8 = puVar1[1];
  auVar182._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar95 * (ulong)(uVar7 + 1));
  auVar182._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar95 * (ulong)(uVar4 + 1));
  auVar170._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar95 * (ulong)(uVar8 + 1));
  auVar170._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar95 * (ulong)(uVar5 + 1));
  auVar200._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar95 * (ulong)(uVar10 + 1));
  auVar200._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar95 * (ulong)(uVar9 + 1));
  lVar13 = *(long *)(lVar93 + 0x38 + lVar89);
  lVar93 = *(long *)(lVar93 + 0x48 + lVar89);
  lVar95 = (ulong)uVar4 * lVar93;
  auVar208._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar6 * lVar93);
  auVar208._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar90 * lVar93);
  auVar217._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar7 * lVar93);
  auVar217._0_16_ = *(undefined1 (*) [16])(lVar13 + lVar95);
  auVar227._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar8 * lVar93);
  auVar227._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar5 * lVar93);
  auVar246._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar10 * lVar93);
  auVar246._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar9 * lVar93);
  auVar129._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar6 + 1) * lVar93);
  auVar129._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar90 + 1) * lVar93);
  auVar118._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar8 + 1) * lVar93);
  auVar118._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar5 + 1) * lVar93);
  fVar250 = fVar250 - auVar30._0_4_;
  auVar33 = vunpcklps_avx(_local_600,auVar110);
  auVar124 = vunpckhps_avx(_local_600,auVar110);
  auVar34 = vunpcklps_avx(_local_6c0,auVar148);
  auVar32 = vunpckhps_avx(_local_6c0,auVar148);
  auVar35 = vunpcklps_avx(auVar33,auVar34);
  auVar33 = vunpckhps_avx(auVar33,auVar34);
  auVar36 = vunpcklps_avx(auVar124,auVar32);
  auVar124 = vunpckhps_avx(auVar124,auVar32);
  auVar37 = vunpcklps_avx(_local_5c0,auVar170);
  auVar32 = vunpckhps_avx(_local_5c0,auVar170);
  auVar38 = vunpcklps_avx(auVar182,auVar200);
  auVar34 = vunpckhps_avx(auVar182,auVar200);
  auVar39 = vunpcklps_avx(auVar37,auVar38);
  auVar37 = vunpckhps_avx(auVar37,auVar38);
  auVar40 = vunpcklps_avx(auVar32,auVar34);
  auVar32 = vunpckhps_avx(auVar32,auVar34);
  auVar41 = vunpcklps_avx(auVar208,auVar227);
  auVar34 = vunpckhps_avx(auVar208,auVar227);
  auVar42 = vunpcklps_avx(auVar217,auVar246);
  auVar38 = vunpckhps_avx(auVar217,auVar246);
  auVar100 = vunpcklps_avx(auVar41,auVar42);
  auVar41 = vunpckhps_avx(auVar41,auVar42);
  auVar101 = vunpcklps_avx(auVar34,auVar38);
  auVar34 = vunpckhps_avx(auVar34,auVar38);
  auVar43 = vunpcklps_avx(auVar129,auVar118);
  auVar38 = vunpckhps_avx(auVar129,auVar118);
  auVar130._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar7 + 1) * lVar93);
  auVar130._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar4 + 1) * lVar93);
  auVar218._16_16_ = *(undefined1 (*) [16])(lVar13 + lVar93 * (ulong)(uVar10 + 1));
  auVar218._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar9 + 1) * lVar93);
  auVar110 = vunpcklps_avx(auVar130,auVar218);
  auVar42 = vunpckhps_avx(auVar130,auVar218);
  auVar111 = vunpcklps_avx(auVar43,auVar110);
  auVar43 = vunpckhps_avx(auVar43,auVar110);
  auVar110 = vunpcklps_avx(auVar38,auVar42);
  auVar38 = vunpckhps_avx(auVar38,auVar42);
  auVar30 = vshufps_avx(ZEXT416((uint)fVar250),ZEXT416((uint)fVar250),0);
  auVar31 = vshufps_avx(ZEXT416((uint)(1.0 - fVar250)),ZEXT416((uint)(1.0 - fVar250)),0);
  fVar250 = auVar30._0_4_;
  fVar216 = auVar30._4_4_;
  fVar199 = auVar30._8_4_;
  fVar127 = auVar30._12_4_;
  fVar194 = auVar31._0_4_;
  fVar198 = auVar31._4_4_;
  fVar109 = auVar31._8_4_;
  fVar128 = auVar31._12_4_;
  fVar135 = auVar35._28_4_;
  auVar141._0_4_ = auVar35._0_4_ * fVar194 + auVar100._0_4_ * fVar250;
  auVar141._4_4_ = auVar35._4_4_ * fVar198 + auVar100._4_4_ * fVar216;
  auVar141._8_4_ = auVar35._8_4_ * fVar109 + auVar100._8_4_ * fVar199;
  auVar141._12_4_ = auVar35._12_4_ * fVar128 + auVar100._12_4_ * fVar127;
  auVar141._16_4_ = auVar35._16_4_ * fVar194 + auVar100._16_4_ * fVar250;
  auVar141._20_4_ = auVar35._20_4_ * fVar198 + auVar100._20_4_ * fVar216;
  auVar141._24_4_ = auVar35._24_4_ * fVar109 + auVar100._24_4_ * fVar199;
  auVar141._28_4_ = fVar135 + 0.0;
  auVar209._0_4_ = auVar33._0_4_ * fVar194 + fVar250 * auVar41._0_4_;
  auVar209._4_4_ = auVar33._4_4_ * fVar198 + fVar216 * auVar41._4_4_;
  auVar209._8_4_ = auVar33._8_4_ * fVar109 + fVar199 * auVar41._8_4_;
  auVar209._12_4_ = auVar33._12_4_ * fVar128 + fVar127 * auVar41._12_4_;
  auVar209._16_4_ = auVar33._16_4_ * fVar194 + fVar250 * auVar41._16_4_;
  auVar209._20_4_ = auVar33._20_4_ * fVar198 + fVar216 * auVar41._20_4_;
  auVar209._24_4_ = auVar33._24_4_ * fVar109 + fVar199 * auVar41._24_4_;
  auVar209._28_4_ = fVar135 + auVar41._28_4_;
  auVar251._0_4_ = auVar36._0_4_ * fVar194 + auVar101._0_4_ * fVar250;
  auVar251._4_4_ = auVar36._4_4_ * fVar198 + auVar101._4_4_ * fVar216;
  auVar251._8_4_ = auVar36._8_4_ * fVar109 + auVar101._8_4_ * fVar199;
  auVar251._12_4_ = auVar36._12_4_ * fVar128 + auVar101._12_4_ * fVar127;
  auVar251._16_4_ = auVar36._16_4_ * fVar194 + auVar101._16_4_ * fVar250;
  auVar251._20_4_ = auVar36._20_4_ * fVar198 + auVar101._20_4_ * fVar216;
  auVar251._24_4_ = auVar36._24_4_ * fVar109 + auVar101._24_4_ * fVar199;
  auVar251._28_4_ = auVar101._28_4_ + fVar135;
  auVar171._8_4_ = 0x3f800000;
  auVar171._0_8_ = &DAT_3f8000003f800000;
  auVar171._12_4_ = 0x3f800000;
  auVar171._16_4_ = 0x3f800000;
  auVar171._20_4_ = 0x3f800000;
  auVar171._24_4_ = 0x3f800000;
  auVar171._28_4_ = 0x3f800000;
  fVar145 = fVar194 * auVar124._0_4_ + fVar250 * auVar34._0_4_;
  fVar150 = fVar198 * auVar124._4_4_ + fVar216 * auVar34._4_4_;
  fVar153 = fVar109 * auVar124._8_4_ + fVar199 * auVar34._8_4_;
  fVar156 = fVar128 * auVar124._12_4_ + fVar127 * auVar34._12_4_;
  fVar159 = fVar194 * auVar124._16_4_ + fVar250 * auVar34._16_4_;
  fVar162 = fVar198 * auVar124._20_4_ + fVar216 * auVar34._20_4_;
  fVar165 = fVar109 * auVar124._24_4_ + fVar199 * auVar34._24_4_;
  uStack_5e8._4_4_ = auVar124._28_4_ + auVar34._28_4_;
  local_600._4_4_ = fVar150;
  local_600._0_4_ = fVar145;
  fStack_5f8 = fVar153;
  fStack_5f4 = fVar156;
  uStack_5f0._0_4_ = fVar159;
  uStack_5f0._4_4_ = fVar162;
  uStack_5e8._0_4_ = fVar165;
  fVar135 = auVar43._28_4_;
  local_5c0._0_4_ = auVar39._0_4_;
  local_5c0._4_4_ = auVar39._4_4_;
  fStack_5b8 = auVar39._8_4_;
  fStack_5b4 = auVar39._12_4_;
  uStack_5b0._0_4_ = auVar39._16_4_;
  uStack_5b0._4_4_ = auVar39._20_4_;
  uStack_5a8._0_4_ = auVar39._24_4_;
  local_640._0_4_ = fVar194 * (float)local_5c0._0_4_ + auVar111._0_4_ * fVar250;
  local_640._4_4_ = fVar198 * (float)local_5c0._4_4_ + auVar111._4_4_ * fVar216;
  fStack_638 = fVar109 * fStack_5b8 + auVar111._8_4_ * fVar199;
  fStack_634 = fVar128 * fStack_5b4 + auVar111._12_4_ * fVar127;
  fStack_630 = fVar194 * (float)uStack_5b0 + auVar111._16_4_ * fVar250;
  fStack_62c = fVar198 * uStack_5b0._4_4_ + auVar111._20_4_ * fVar216;
  fStack_628 = fVar109 * (float)uStack_5a8 + auVar111._24_4_ * fVar199;
  fStack_624 = auVar38._28_4_ + uStack_5e8._4_4_;
  local_5a0 = auVar37._0_4_;
  fStack_59c = auVar37._4_4_;
  fStack_598 = auVar37._8_4_;
  fStack_594 = auVar37._12_4_;
  fStack_590 = auVar37._16_4_;
  fStack_58c = auVar37._20_4_;
  fStack_588 = auVar37._24_4_;
  auVar228._0_4_ = fVar194 * local_5a0 + fVar250 * auVar43._0_4_;
  auVar228._4_4_ = fVar198 * fStack_59c + fVar216 * auVar43._4_4_;
  auVar228._8_4_ = fVar109 * fStack_598 + fVar199 * auVar43._8_4_;
  auVar228._12_4_ = fVar128 * fStack_594 + fVar127 * auVar43._12_4_;
  auVar228._16_4_ = fVar194 * fStack_590 + fVar250 * auVar43._16_4_;
  auVar228._20_4_ = fVar198 * fStack_58c + fVar216 * auVar43._20_4_;
  auVar228._24_4_ = fVar109 * fStack_588 + fVar199 * auVar43._24_4_;
  auVar228._28_4_ = auVar38._28_4_ + fVar135;
  local_580 = auVar40._0_4_;
  fStack_57c = auVar40._4_4_;
  fStack_578 = auVar40._8_4_;
  fStack_574 = auVar40._12_4_;
  fStack_570 = auVar40._16_4_;
  fStack_56c = auVar40._20_4_;
  fStack_568 = auVar40._24_4_;
  auVar247._0_4_ = fVar194 * local_580 + auVar110._0_4_ * fVar250;
  auVar247._4_4_ = fVar198 * fStack_57c + auVar110._4_4_ * fVar216;
  auVar247._8_4_ = fVar109 * fStack_578 + auVar110._8_4_ * fVar199;
  auVar247._12_4_ = fVar128 * fStack_574 + auVar110._12_4_ * fVar127;
  auVar247._16_4_ = fVar194 * fStack_570 + auVar110._16_4_ * fVar250;
  auVar247._20_4_ = fVar198 * fStack_56c + auVar110._20_4_ * fVar216;
  auVar247._24_4_ = fVar109 * fStack_568 + auVar110._24_4_ * fVar199;
  auVar247._28_4_ = fVar135 + auVar34._28_4_;
  local_6c0._0_4_ = auVar32._0_4_;
  local_6c0._4_4_ = auVar32._4_4_;
  fStack_6b8 = auVar32._8_4_;
  fStack_6b4 = auVar32._12_4_;
  uStack_6b0._0_4_ = auVar32._16_4_;
  uStack_6b0._4_4_ = auVar32._20_4_;
  uStack_6a8._0_4_ = auVar32._24_4_;
  auVar99._0_4_ = fVar194 * (float)local_6c0._0_4_ + fVar250 * auVar38._0_4_;
  auVar99._4_4_ = fVar198 * (float)local_6c0._4_4_ + fVar216 * auVar38._4_4_;
  auVar99._8_4_ = fVar109 * fStack_6b8 + fVar199 * auVar38._8_4_;
  auVar99._12_4_ = fVar128 * fStack_6b4 + fVar127 * auVar38._12_4_;
  auVar100._16_4_ = fVar194 * (float)uStack_6b0 + fVar250 * auVar38._16_4_;
  auVar100._0_16_ = auVar99;
  auVar100._20_4_ = fVar198 * uStack_6b0._4_4_ + fVar216 * auVar38._20_4_;
  auVar100._24_4_ = fVar109 * (float)uStack_6a8 + fVar199 * auVar38._24_4_;
  auVar100._28_4_ = fVar135 + fVar127;
  auVar30 = vpcmpeqd_avx(auVar99,auVar99);
  auVar31 = vpcmpeqd_avx(auVar30,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  auVar30 = vpcmpeqd_avx(auVar30,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  local_330 = vshufps_avx(ZEXT416(uVar88),ZEXT416(uVar88),0);
  local_340 = local_330;
  local_240 = *(float *)(ray + k * 4 + 0x80);
  fVar250 = *(float *)(ray + k * 4 + 0xa0);
  fVar194 = *(float *)(ray + k * 4 + 0xc0);
  auVar117 = ZEXT416((uint)(local_240 * local_240 + fVar250 * fVar250 + fVar194 * fVar194));
  auVar117 = vshufps_avx(auVar117,auVar117,0);
  auVar119._16_16_ = auVar117;
  auVar119._0_16_ = auVar117;
  auVar124 = vrcpps_avx(auVar119);
  auVar101._16_16_ = auVar30;
  auVar101._0_16_ = auVar31;
  fVar128 = auVar124._0_4_;
  fVar135 = auVar124._4_4_;
  auVar32._4_4_ = fVar135 * auVar117._4_4_;
  auVar32._0_4_ = fVar128 * auVar117._0_4_;
  fVar136 = auVar124._8_4_;
  auVar32._8_4_ = fVar136 * auVar117._8_4_;
  fVar137 = auVar124._12_4_;
  auVar32._12_4_ = fVar137 * auVar117._12_4_;
  fVar138 = auVar124._16_4_;
  auVar32._16_4_ = fVar138 * auVar117._0_4_;
  fVar139 = auVar124._20_4_;
  auVar32._20_4_ = fVar139 * auVar117._4_4_;
  fVar140 = auVar124._24_4_;
  auVar32._24_4_ = fVar140 * auVar117._8_4_;
  auVar32._28_4_ = auVar30._12_4_;
  auVar32 = vsubps_avx(auVar171,auVar32);
  fVar109 = auVar124._28_4_ + auVar32._28_4_;
  auVar34._4_4_ = (auVar141._4_4_ + (float)local_640._4_4_) * 0.5;
  auVar34._0_4_ = (auVar141._0_4_ + (float)local_640._0_4_) * 0.5;
  auVar34._8_4_ = (auVar141._8_4_ + fStack_638) * 0.5;
  auVar34._12_4_ = (auVar141._12_4_ + fStack_634) * 0.5;
  auVar34._16_4_ = (auVar141._16_4_ + fStack_630) * 0.5;
  auVar34._20_4_ = (auVar141._20_4_ + fStack_62c) * 0.5;
  auVar34._24_4_ = (auVar141._24_4_ + fStack_628) * 0.5;
  auVar34._28_4_ = auVar141._28_4_ + fStack_624;
  auVar124._4_4_ = (auVar209._4_4_ + auVar228._4_4_) * 0.5;
  auVar124._0_4_ = (auVar209._0_4_ + auVar228._0_4_) * 0.5;
  auVar124._8_4_ = (auVar209._8_4_ + auVar228._8_4_) * 0.5;
  auVar124._12_4_ = (auVar209._12_4_ + auVar228._12_4_) * 0.5;
  auVar124._16_4_ = (auVar209._16_4_ + auVar228._16_4_) * 0.5;
  auVar124._20_4_ = (auVar209._20_4_ + auVar228._20_4_) * 0.5;
  auVar124._24_4_ = (auVar209._24_4_ + auVar228._24_4_) * 0.5;
  auVar124._28_4_ = auVar209._28_4_ + auVar228._28_4_;
  auVar33._4_4_ = (auVar251._4_4_ + auVar247._4_4_) * 0.5;
  auVar33._0_4_ = (auVar251._0_4_ + auVar247._0_4_) * 0.5;
  auVar33._8_4_ = (auVar251._8_4_ + auVar247._8_4_) * 0.5;
  auVar33._12_4_ = (auVar251._12_4_ + auVar247._12_4_) * 0.5;
  auVar33._16_4_ = (auVar251._16_4_ + auVar247._16_4_) * 0.5;
  auVar33._20_4_ = (auVar251._20_4_ + auVar247._20_4_) * 0.5;
  auVar33._24_4_ = (auVar251._24_4_ + auVar247._24_4_) * 0.5;
  auVar33._28_4_ = 0x3f000000;
  fVar216 = *(float *)(ray + k * 4 + 0x20);
  auVar149._4_4_ = fVar216;
  auVar149._0_4_ = fVar216;
  auVar149._8_4_ = fVar216;
  auVar149._12_4_ = fVar216;
  auVar149._16_4_ = fVar216;
  auVar149._20_4_ = fVar216;
  auVar149._24_4_ = fVar216;
  auVar149._28_4_ = fVar216;
  auVar124 = vsubps_avx(auVar124,auVar149);
  fVar198 = *(float *)(ray + k * 4 + 0x40);
  auVar183._4_4_ = fVar198;
  auVar183._0_4_ = fVar198;
  auVar183._8_4_ = fVar198;
  auVar183._12_4_ = fVar198;
  auVar183._16_4_ = fVar198;
  auVar183._20_4_ = fVar198;
  auVar183._24_4_ = fVar198;
  auVar183._28_4_ = fVar198;
  auVar33 = vsubps_avx(auVar33,auVar183);
  fVar127 = auVar124._28_4_ + auVar33._28_4_;
  fVar199 = *(float *)(ray + k * 4);
  auVar131._4_4_ = fVar199;
  auVar131._0_4_ = fVar199;
  auVar131._8_4_ = fVar199;
  auVar131._12_4_ = fVar199;
  auVar131._16_4_ = fVar199;
  auVar131._20_4_ = fVar199;
  auVar131._24_4_ = fVar199;
  auVar131._28_4_ = fVar199;
  auVar34 = vsubps_avx(auVar34,auVar131);
  fStack_4c4 = auVar34._28_4_ + fVar127;
  local_4e0 = (local_240 * auVar34._0_4_ + fVar250 * auVar124._0_4_ + fVar194 * auVar33._0_4_) *
              (fVar128 + fVar128 * auVar32._0_4_);
  fStack_4dc = (local_240 * auVar34._4_4_ + fVar250 * auVar124._4_4_ + fVar194 * auVar33._4_4_) *
               (fVar135 + fVar135 * auVar32._4_4_);
  fStack_4d8 = (local_240 * auVar34._8_4_ + fVar250 * auVar124._8_4_ + fVar194 * auVar33._8_4_) *
               (fVar136 + fVar136 * auVar32._8_4_);
  fStack_4d4 = (local_240 * auVar34._12_4_ + fVar250 * auVar124._12_4_ + fVar194 * auVar33._12_4_) *
               (fVar137 + fVar137 * auVar32._12_4_);
  fStack_4d0 = (local_240 * auVar34._16_4_ + fVar250 * auVar124._16_4_ + fVar194 * auVar33._16_4_) *
               (fVar138 + fVar138 * auVar32._16_4_);
  fStack_4cc = (local_240 * auVar34._20_4_ + fVar250 * auVar124._20_4_ + fVar194 * auVar33._20_4_) *
               (fVar139 + fVar139 * auVar32._20_4_);
  fStack_4c8 = (local_240 * auVar34._24_4_ + fVar250 * auVar124._24_4_ + fVar194 * auVar33._24_4_) *
               (fVar140 + fVar140 * auVar32._24_4_);
  auVar219._0_4_ = fVar199 + local_240 * local_4e0;
  auVar219._4_4_ = fVar199 + local_240 * fStack_4dc;
  auVar219._8_4_ = fVar199 + local_240 * fStack_4d8;
  auVar219._12_4_ = fVar199 + local_240 * fStack_4d4;
  auVar219._16_4_ = fVar199 + local_240 * fStack_4d0;
  auVar219._20_4_ = fVar199 + local_240 * fStack_4cc;
  auVar219._24_4_ = fVar199 + local_240 * fStack_4c8;
  auVar219._28_4_ = fVar199 + fVar109;
  auVar142._0_4_ = fVar216 + fVar250 * local_4e0;
  auVar142._4_4_ = fVar216 + fVar250 * fStack_4dc;
  auVar142._8_4_ = fVar216 + fVar250 * fStack_4d8;
  auVar142._12_4_ = fVar216 + fVar250 * fStack_4d4;
  auVar142._16_4_ = fVar216 + fVar250 * fStack_4d0;
  auVar142._20_4_ = fVar216 + fVar250 * fStack_4cc;
  auVar142._24_4_ = fVar216 + fVar250 * fStack_4c8;
  auVar142._28_4_ = fVar216 + fVar109;
  auVar111._0_4_ = fVar198 + fVar194 * local_4e0;
  auVar111._4_4_ = fVar198 + fVar194 * fStack_4dc;
  auVar111._8_4_ = fVar198 + fVar194 * fStack_4d8;
  auVar111._12_4_ = fVar198 + fVar194 * fStack_4d4;
  auVar111._16_4_ = fVar198 + fVar194 * fStack_4d0;
  auVar111._20_4_ = fVar198 + fVar194 * fStack_4cc;
  auVar111._24_4_ = fVar198 + fVar194 * fStack_4c8;
  auVar111._28_4_ = fVar198 + fVar109;
  local_480 = vsubps_avx(auVar228,auVar209);
  local_4a0 = vsubps_avx(auVar247,auVar251);
  fVar198 = local_4a0._0_4_;
  fVar136 = local_4a0._4_4_;
  fVar255 = local_4a0._8_4_;
  fVar240 = local_4a0._12_4_;
  fVar245 = local_4a0._16_4_;
  fVar20 = local_4a0._20_4_;
  fVar25 = local_4a0._24_4_;
  fVar199 = local_480._0_4_;
  fVar137 = local_480._4_4_;
  fVar256 = local_480._8_4_;
  fVar241 = local_480._12_4_;
  fVar16 = local_480._16_4_;
  fVar21 = local_480._20_4_;
  fVar26 = local_480._24_4_;
  _local_5c0 = vsubps_avx(_local_640,auVar141);
  fVar109 = local_5c0._0_4_;
  fVar138 = local_5c0._4_4_;
  fVar257 = local_5c0._8_4_;
  fVar242 = local_5c0._12_4_;
  fVar17 = local_5c0._16_4_;
  fVar22 = local_5c0._20_4_;
  fVar27 = local_5c0._24_4_;
  fVar146 = fVar109 * fVar109 + fVar199 * fVar199 + fVar198 * fVar198;
  fVar151 = fVar138 * fVar138 + fVar137 * fVar137 + fVar136 * fVar136;
  fVar154 = fVar257 * fVar257 + fVar256 * fVar256 + fVar255 * fVar255;
  fVar157 = fVar242 * fVar242 + fVar241 * fVar241 + fVar240 * fVar240;
  fVar160 = fVar17 * fVar17 + fVar16 * fVar16 + fVar245 * fVar245;
  fVar163 = fVar22 * fVar22 + fVar21 * fVar21 + fVar20 * fVar20;
  fVar166 = fVar27 * fVar27 + fVar26 * fVar26 + fVar25 * fVar25;
  fVar168 = fStack_624 + fVar127 + fVar216;
  _local_620 = vsubps_avx(auVar142,auVar209);
  _local_4c0 = vsubps_avx(auVar111,auVar251);
  fVar216 = local_4c0._0_4_;
  fVar139 = local_4c0._4_4_;
  fVar221 = local_4c0._8_4_;
  fVar222 = local_4c0._12_4_;
  fVar223 = local_4c0._16_4_;
  fVar224 = local_4c0._20_4_;
  fVar225 = local_4c0._24_4_;
  fVar127 = local_620._0_4_;
  fVar140 = local_620._4_4_;
  fVar210 = local_620._8_4_;
  fVar211 = local_620._12_4_;
  fVar212 = local_620._16_4_;
  fVar213 = local_620._20_4_;
  fVar214 = local_620._24_4_;
  _local_440 = vsubps_avx(auVar219,auVar141);
  fVar128 = local_440._0_4_;
  fVar253 = local_440._4_4_;
  fVar258 = local_440._8_4_;
  fVar243 = local_440._12_4_;
  fVar18 = local_440._16_4_;
  fVar23 = local_440._20_4_;
  fVar28 = local_440._24_4_;
  fVar226 = fVar109 * fVar128 + fVar199 * fVar127 + fVar198 * fVar216;
  fVar230 = fVar138 * fVar253 + fVar137 * fVar140 + fVar136 * fVar139;
  fVar231 = fVar257 * fVar258 + fVar256 * fVar210 + fVar255 * fVar221;
  fVar232 = fVar242 * fVar243 + fVar241 * fVar211 + fVar240 * fVar222;
  fVar233 = fVar17 * fVar18 + fVar16 * fVar212 + fVar245 * fVar223;
  fVar234 = fVar22 * fVar23 + fVar21 * fVar213 + fVar20 * fVar224;
  fVar235 = fVar27 * fVar28 + fVar26 * fVar214 + fVar25 * fVar225;
  fVar236 = fStack_624 + fStack_624 + auVar111._28_4_;
  fVar116 = fStack_624 + fStack_624 + auVar111._28_4_;
  auVar220._0_4_ = fVar109 * local_240 + fVar250 * fVar199 + fVar194 * fVar198;
  auVar220._4_4_ = fVar138 * local_240 + fVar250 * fVar137 + fVar194 * fVar136;
  auVar220._8_4_ = fVar257 * local_240 + fVar250 * fVar256 + fVar194 * fVar255;
  auVar220._12_4_ = fVar242 * local_240 + fVar250 * fVar241 + fVar194 * fVar240;
  auVar220._16_4_ = fVar17 * local_240 + fVar250 * fVar16 + fVar194 * fVar245;
  auVar220._20_4_ = fVar22 * local_240 + fVar250 * fVar21 + fVar194 * fVar20;
  auVar220._24_4_ = fVar27 * local_240 + fVar250 * fVar26 + fVar194 * fVar25;
  auVar220._28_4_ = fStack_624 + fVar116;
  fStack_59c = fVar194;
  local_5a0 = fVar194;
  fStack_598 = fVar194;
  fStack_594 = fVar194;
  fStack_590 = fVar194;
  fStack_58c = fVar194;
  fStack_588 = fVar194;
  fStack_584 = fVar194;
  fStack_57c = fVar250;
  local_580 = fVar250;
  fStack_578 = fVar250;
  fStack_574 = fVar250;
  fStack_570 = fVar250;
  fStack_56c = fVar250;
  fStack_568 = fVar250;
  fStack_564 = fVar250;
  fStack_23c = local_240;
  fStack_238 = local_240;
  fStack_234 = local_240;
  fStack_230 = local_240;
  fStack_22c = local_240;
  fStack_228 = local_240;
  fStack_224 = local_240;
  fVar44 = local_480._28_4_;
  auVar124 = vsubps_avx(_local_600,auVar100);
  fVar135 = auVar124._0_4_;
  fVar254 = auVar124._4_4_;
  fVar237 = auVar124._8_4_;
  fVar244 = auVar124._12_4_;
  fVar19 = auVar124._16_4_;
  fVar24 = auVar124._20_4_;
  fVar29 = auVar124._24_4_;
  local_3c0 = fVar135 * fVar135 + fVar146;
  fStack_3bc = fVar254 * fVar254 + fVar151;
  fStack_3b8 = fVar237 * fVar237 + fVar154;
  fStack_3b4 = fVar244 * fVar244 + fVar157;
  fStack_3b0 = fVar19 * fVar19 + fVar160;
  fStack_3ac = fVar24 * fVar24 + fVar163;
  fStack_3a8 = fVar29 * fVar29 + fVar166;
  fVar169 = fVar146 * fVar146;
  fVar175 = fVar151 * fVar151;
  local_260._4_4_ = fVar175;
  local_260._0_4_ = fVar169;
  fVar176 = fVar154 * fVar154;
  fStack_258 = fVar176;
  fVar177 = fVar157 * fVar157;
  fStack_254 = fVar177;
  fVar178 = fVar160 * fVar160;
  fStack_250 = fVar178;
  fVar179 = fVar163 * fVar163;
  fStack_24c = fVar179;
  fVar215 = local_620._28_4_;
  fVar180 = fVar166 * fVar166;
  fStack_248 = fVar180;
  uStack_244 = fVar215;
  auVar37._4_4_ = fVar175 * (local_240 * fVar253 + fVar250 * fVar140 + fVar194 * fVar139);
  auVar37._0_4_ = fVar169 * (local_240 * fVar128 + fVar250 * fVar127 + fVar194 * fVar216);
  auVar37._8_4_ = fVar176 * (local_240 * fVar258 + fVar250 * fVar210 + fVar194 * fVar221);
  auVar37._12_4_ = fVar177 * (local_240 * fVar243 + fVar250 * fVar211 + fVar194 * fVar222);
  auVar37._16_4_ = fVar178 * (local_240 * fVar18 + fVar250 * fVar212 + fVar194 * fVar223);
  auVar37._20_4_ = fVar179 * (local_240 * fVar23 + fVar250 * fVar213 + fVar194 * fVar224);
  auVar37._24_4_ = fVar180 * (local_240 * fVar28 + fVar250 * fVar214 + fVar194 * fVar225);
  auVar37._28_4_ = fStack_624 + fStack_624 + fVar116;
  auVar38._4_4_ = fStack_3bc * auVar220._4_4_ * fVar230;
  auVar38._0_4_ = local_3c0 * auVar220._0_4_ * fVar226;
  auVar38._8_4_ = fStack_3b8 * auVar220._8_4_ * fVar231;
  auVar38._12_4_ = fStack_3b4 * auVar220._12_4_ * fVar232;
  auVar38._16_4_ = fStack_3b0 * auVar220._16_4_ * fVar233;
  auVar38._20_4_ = fStack_3ac * auVar220._20_4_ * fVar234;
  auVar38._24_4_ = fStack_3a8 * auVar220._24_4_ * fVar235;
  auVar38._28_4_ = fVar44;
  auVar32 = vsubps_avx(auVar37,auVar38);
  fVar181 = fVar145 * fVar146;
  fVar188 = fVar150 * fVar151;
  auVar41._4_4_ = fVar188;
  auVar41._0_4_ = fVar181;
  fVar189 = fVar153 * fVar154;
  auVar41._8_4_ = fVar189;
  fVar190 = fVar156 * fVar157;
  auVar41._12_4_ = fVar190;
  fVar191 = fVar159 * fVar160;
  auVar41._16_4_ = fVar191;
  fVar192 = fVar162 * fVar163;
  auVar41._20_4_ = fVar192;
  fVar193 = fVar165 * fVar166;
  auVar41._24_4_ = fVar193;
  auVar41._28_4_ = uStack_5e8._4_4_;
  auVar132._0_4_ = fVar181 * fVar135 * auVar220._0_4_ + auVar32._0_4_;
  auVar132._4_4_ = fVar188 * fVar254 * auVar220._4_4_ + auVar32._4_4_;
  auVar132._8_4_ = fVar189 * fVar237 * auVar220._8_4_ + auVar32._8_4_;
  auVar132._12_4_ = fVar190 * fVar244 * auVar220._12_4_ + auVar32._12_4_;
  auVar132._16_4_ = fVar191 * fVar19 * auVar220._16_4_ + auVar32._16_4_;
  auVar132._20_4_ = fVar192 * fVar24 * auVar220._20_4_ + auVar32._20_4_;
  auVar132._24_4_ = fVar193 * fVar29 * auVar220._24_4_ + auVar32._24_4_;
  auVar132._28_4_ = fVar44 + auVar32._28_4_;
  auVar42._4_4_ = fVar175 * (fVar253 * fVar253 + fVar140 * fVar140 + fVar139 * fVar139);
  auVar42._0_4_ = fVar169 * (fVar128 * fVar128 + fVar127 * fVar127 + fVar216 * fVar216);
  auVar42._8_4_ = fVar176 * (fVar258 * fVar258 + fVar210 * fVar210 + fVar221 * fVar221);
  auVar42._12_4_ = fVar177 * (fVar243 * fVar243 + fVar211 * fVar211 + fVar222 * fVar222);
  auVar42._16_4_ = fVar178 * (fVar18 * fVar18 + fVar212 * fVar212 + fVar223 * fVar223);
  auVar42._20_4_ = fVar179 * (fVar23 * fVar23 + fVar213 * fVar213 + fVar224 * fVar224);
  auVar42._24_4_ = fVar180 * (fVar28 * fVar28 + fVar214 * fVar214 + fVar225 * fVar225);
  auVar42._28_4_ = auVar32._28_4_;
  auVar43._4_4_ = fStack_3bc * fVar230 * fVar230;
  auVar43._0_4_ = local_3c0 * fVar226 * fVar226;
  auVar43._8_4_ = fStack_3b8 * fVar231 * fVar231;
  auVar43._12_4_ = fStack_3b4 * fVar232 * fVar232;
  auVar43._16_4_ = fStack_3b0 * fVar233 * fVar233;
  auVar43._20_4_ = fStack_3ac * fVar234 * fVar234;
  auVar43._24_4_ = fStack_3a8 * fVar235 * fVar235;
  auVar43._28_4_ = fVar44 + fVar44 + fStack_624;
  auVar32 = vsubps_avx(auVar42,auVar43);
  auVar35._4_4_ = fVar230 * (fVar254 + fVar254);
  auVar35._0_4_ = fVar226 * (fVar135 + fVar135);
  auVar35._8_4_ = fVar231 * (fVar237 + fVar237);
  auVar35._12_4_ = fVar232 * (fVar244 + fVar244);
  auVar35._16_4_ = fVar233 * (fVar19 + fVar19);
  auVar35._20_4_ = fVar234 * (fVar24 + fVar24);
  auVar35._24_4_ = fVar235 * (fVar29 + fVar29);
  auVar35._28_4_ = auVar124._28_4_ + auVar124._28_4_;
  auVar124 = vsubps_avx(auVar35,auVar41);
  fVar116 = auVar124._28_4_;
  fVar147 = auVar220._0_4_ * auVar220._0_4_;
  fVar152 = auVar220._4_4_ * auVar220._4_4_;
  fVar155 = auVar220._8_4_ * auVar220._8_4_;
  fVar158 = auVar220._12_4_ * auVar220._12_4_;
  fVar161 = auVar220._16_4_ * auVar220._16_4_;
  fVar164 = auVar220._20_4_ * auVar220._20_4_;
  fVar167 = auVar220._24_4_ * auVar220._24_4_;
  auVar36._4_4_ = fStack_3bc * fVar152;
  auVar36._0_4_ = local_3c0 * fVar147;
  auVar36._8_4_ = fStack_3b8 * fVar155;
  auVar36._12_4_ = fStack_3b4 * fVar158;
  auVar36._16_4_ = fStack_3b0 * fVar161;
  auVar36._20_4_ = fStack_3ac * fVar164;
  auVar36._24_4_ = fStack_3a8 * fVar167;
  auVar36._28_4_ = fVar116;
  auVar33 = vsubps_avx(_local_260,auVar36);
  auVar39._4_4_ = auVar33._4_4_ * (auVar32._4_4_ + fVar188 * auVar124._4_4_);
  auVar39._0_4_ = auVar33._0_4_ * (auVar32._0_4_ + fVar181 * auVar124._0_4_);
  auVar39._8_4_ = auVar33._8_4_ * (auVar32._8_4_ + fVar189 * auVar124._8_4_);
  auVar39._12_4_ = auVar33._12_4_ * (auVar32._12_4_ + fVar190 * auVar124._12_4_);
  auVar39._16_4_ = auVar33._16_4_ * (auVar32._16_4_ + fVar191 * auVar124._16_4_);
  auVar39._20_4_ = auVar33._20_4_ * (auVar32._20_4_ + fVar192 * auVar124._20_4_);
  auVar39._24_4_ = auVar33._24_4_ * (auVar32._24_4_ + fVar193 * auVar124._24_4_);
  auVar39._28_4_ = auVar32._28_4_ + fVar116;
  auVar40._4_4_ = auVar132._4_4_ * auVar132._4_4_;
  auVar40._0_4_ = auVar132._0_4_ * auVar132._0_4_;
  auVar40._8_4_ = auVar132._8_4_ * auVar132._8_4_;
  auVar40._12_4_ = auVar132._12_4_ * auVar132._12_4_;
  auVar40._16_4_ = auVar132._16_4_ * auVar132._16_4_;
  auVar40._20_4_ = auVar132._20_4_ * auVar132._20_4_;
  auVar40._24_4_ = auVar132._24_4_ * auVar132._24_4_;
  auVar40._28_4_ = fVar116;
  auVar32 = vsubps_avx(auVar40,auVar39);
  auVar124 = vcmpps_avx(auVar32,ZEXT432(0) << 0x20,5);
  auVar34 = auVar124 & ~auVar101;
  if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar34 >> 0x7f,0) != '\0') ||
        (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar34 >> 0xbf,0) != '\0') ||
      (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar34[0x1f] < '\0') {
    auVar34 = vandnps_avx(auVar101,auVar124);
    auVar41 = vsubps_avx(auVar219,_local_640);
    auVar42 = vsubps_avx(auVar142,auVar228);
    auVar43 = vsubps_avx(auVar111,auVar247);
    fVar193 = auVar41._0_4_ * fVar109 + auVar42._0_4_ * fVar199 + auVar43._0_4_ * fVar198;
    fVar202 = auVar41._4_4_ * fVar138 + auVar42._4_4_ * fVar137 + auVar43._4_4_ * fVar136;
    fVar203 = auVar41._8_4_ * fVar257 + auVar42._8_4_ * fVar256 + auVar43._8_4_ * fVar255;
    fVar204 = auVar41._12_4_ * fVar242 + auVar42._12_4_ * fVar241 + auVar43._12_4_ * fVar240;
    fVar205 = auVar41._16_4_ * fVar17 + auVar42._16_4_ * fVar16 + auVar43._16_4_ * fVar245;
    fVar206 = auVar41._20_4_ * fVar22 + auVar42._20_4_ * fVar21 + auVar43._20_4_ * fVar20;
    fVar207 = auVar41._24_4_ * fVar27 + auVar42._24_4_ * fVar26 + auVar43._24_4_ * fVar25;
    auVar32 = vsqrtps_avx(auVar32);
    auVar124 = vrcpps_avx(auVar33);
    fVar116 = auVar124._0_4_;
    auVar172._0_4_ = auVar33._0_4_ * fVar116;
    fVar181 = auVar124._4_4_;
    auVar172._4_4_ = auVar33._4_4_ * fVar181;
    fVar188 = auVar124._8_4_;
    auVar172._8_4_ = auVar33._8_4_ * fVar188;
    fVar189 = auVar124._12_4_;
    auVar172._12_4_ = auVar33._12_4_ * fVar189;
    fVar190 = auVar124._16_4_;
    auVar172._16_4_ = auVar33._16_4_ * fVar190;
    fVar191 = auVar124._20_4_;
    auVar172._20_4_ = auVar33._20_4_ * fVar191;
    fVar192 = auVar124._24_4_;
    auVar172._24_4_ = auVar33._24_4_ * fVar192;
    auVar172._28_4_ = 0;
    auVar252._8_4_ = 0x3f800000;
    auVar252._0_8_ = &DAT_3f8000003f800000;
    auVar252._12_4_ = 0x3f800000;
    auVar252._16_4_ = 0x3f800000;
    auVar252._20_4_ = 0x3f800000;
    auVar252._24_4_ = 0x3f800000;
    auVar252._28_4_ = 0x3f800000;
    auVar124 = vsubps_avx(auVar252,auVar172);
    auVar112._8_4_ = 0x7fffffff;
    auVar112._0_8_ = 0x7fffffff7fffffff;
    auVar112._12_4_ = 0x7fffffff;
    auVar112._16_4_ = 0x7fffffff;
    auVar112._20_4_ = 0x7fffffff;
    auVar112._24_4_ = 0x7fffffff;
    auVar112._28_4_ = 0x7fffffff;
    fVar116 = fVar116 + fVar116 * auVar124._0_4_;
    fVar181 = fVar181 + fVar181 * auVar124._4_4_;
    fVar188 = fVar188 + fVar188 * auVar124._8_4_;
    fVar189 = fVar189 + fVar189 * auVar124._12_4_;
    fVar190 = fVar190 + fVar190 * auVar124._16_4_;
    fVar191 = fVar191 + fVar191 * auVar124._20_4_;
    fVar192 = fVar192 + fVar192 * auVar124._24_4_;
    auVar124 = vandps_avx(auVar33,auVar112);
    auVar195._8_4_ = 0x219392ef;
    auVar195._0_8_ = 0x219392ef219392ef;
    auVar195._12_4_ = 0x219392ef;
    auVar195._16_4_ = 0x219392ef;
    auVar195._20_4_ = 0x219392ef;
    auVar195._24_4_ = 0x219392ef;
    auVar195._28_4_ = 0x219392ef;
    auVar124 = vcmpps_avx(auVar124,auVar195,2);
    uVar91 = CONCAT44(auVar132._4_4_,auVar132._0_4_);
    auVar196._0_8_ = uVar91 ^ 0x8000000080000000;
    auVar196._8_4_ = -auVar132._8_4_;
    auVar196._12_4_ = -auVar132._12_4_;
    auVar196._16_4_ = -auVar132._16_4_;
    auVar196._20_4_ = -auVar132._20_4_;
    auVar196._24_4_ = -auVar132._24_4_;
    auVar196._28_4_ = -auVar132._28_4_;
    auVar33 = vsubps_avx(auVar196,auVar32);
    auVar37 = vsubps_avx(auVar32,auVar132);
    auVar45._4_4_ = auVar33._4_4_ * fVar181;
    auVar45._0_4_ = auVar33._0_4_ * fVar116;
    auVar45._8_4_ = auVar33._8_4_ * fVar188;
    auVar45._12_4_ = auVar33._12_4_ * fVar189;
    auVar45._16_4_ = auVar33._16_4_ * fVar190;
    auVar45._20_4_ = auVar33._20_4_ * fVar191;
    auVar45._24_4_ = auVar33._24_4_ * fVar192;
    auVar45._28_4_ = auVar132._28_4_;
    auVar46._4_4_ = auVar37._4_4_ * fVar181;
    auVar46._0_4_ = auVar37._0_4_ * fVar116;
    auVar46._8_4_ = auVar37._8_4_ * fVar188;
    auVar46._12_4_ = auVar37._12_4_ * fVar189;
    auVar46._16_4_ = auVar37._16_4_ * fVar190;
    auVar46._20_4_ = auVar37._20_4_ * fVar191;
    auVar46._24_4_ = auVar37._24_4_ * fVar192;
    auVar46._28_4_ = auVar37._28_4_;
    auVar102._8_4_ = 0xff800000;
    auVar102._0_8_ = 0xff800000ff800000;
    auVar102._12_4_ = 0xff800000;
    auVar102._16_4_ = 0xff800000;
    auVar102._20_4_ = 0xff800000;
    auVar102._24_4_ = 0xff800000;
    auVar102._28_4_ = 0xff800000;
    auVar32 = vblendvps_avx(auVar45,auVar102,auVar124);
    auVar248._8_4_ = 0x7f800000;
    auVar248._0_8_ = 0x7f8000007f800000;
    auVar248._12_4_ = 0x7f800000;
    auVar248._16_4_ = 0x7f800000;
    auVar248._20_4_ = 0x7f800000;
    auVar248._24_4_ = 0x7f800000;
    auVar248._28_4_ = 0x7f800000;
    auVar33 = vblendvps_avx(auVar46,auVar248,auVar124);
    auVar173._0_4_ = fVar226 + auVar220._0_4_ * auVar32._0_4_;
    auVar173._4_4_ = fVar230 + auVar220._4_4_ * auVar32._4_4_;
    auVar173._8_4_ = fVar231 + auVar220._8_4_ * auVar32._8_4_;
    auVar173._12_4_ = fVar232 + auVar220._12_4_ * auVar32._12_4_;
    auVar173._16_4_ = fVar233 + auVar220._16_4_ * auVar32._16_4_;
    auVar173._20_4_ = fVar234 + auVar220._20_4_ * auVar32._20_4_;
    auVar173._24_4_ = fVar235 + auVar220._24_4_ * auVar32._24_4_;
    auVar173._28_4_ = fVar236 + auVar37._28_4_;
    auVar124 = vcmpps_avx(auVar173,ZEXT832(0) << 0x20,6);
    auVar86._4_4_ = fVar151;
    auVar86._0_4_ = fVar146;
    auVar86._8_4_ = fVar154;
    auVar86._12_4_ = fVar157;
    auVar86._16_4_ = fVar160;
    auVar86._20_4_ = fVar163;
    auVar86._24_4_ = fVar166;
    auVar86._28_4_ = fVar168;
    auVar37 = vcmpps_avx(auVar173,auVar86,1);
    auVar124 = vandps_avx(auVar37,auVar124);
    auVar124 = vandps_avx(auVar124,auVar34);
    _local_640 = vblendvps_avx(auVar248,auVar32,auVar124);
    local_380._0_4_ = fVar226 + auVar220._0_4_ * auVar33._0_4_;
    local_380._4_4_ = fVar230 + auVar220._4_4_ * auVar33._4_4_;
    fStack_378 = fVar231 + auVar220._8_4_ * auVar33._8_4_;
    fStack_374 = fVar232 + auVar220._12_4_ * auVar33._12_4_;
    fStack_370 = fVar233 + auVar220._16_4_ * auVar33._16_4_;
    fStack_36c = fVar234 + auVar220._20_4_ * auVar33._20_4_;
    fStack_368 = fVar235 + auVar220._24_4_ * auVar33._24_4_;
    register0x0000149c = fVar236 + local_640._28_4_;
    auVar124 = vcmpps_avx(_local_380,ZEXT832(0) << 0x20,6);
    auVar32 = vcmpps_avx(_local_380,auVar86,1);
    auVar124 = vandps_avx(auVar32,auVar124);
    auVar124 = vandps_avx(auVar124,auVar34);
    local_420 = vblendvps_avx(auVar102,auVar33,auVar124);
    auVar38 = vrcpps_avx(auVar220);
    fVar116 = auVar38._0_4_;
    fVar181 = auVar38._4_4_;
    auVar47._4_4_ = auVar220._4_4_ * fVar181;
    auVar47._0_4_ = auVar220._0_4_ * fVar116;
    fVar188 = auVar38._8_4_;
    auVar47._8_4_ = auVar220._8_4_ * fVar188;
    fVar189 = auVar38._12_4_;
    auVar47._12_4_ = auVar220._12_4_ * fVar189;
    fVar190 = auVar38._16_4_;
    auVar47._16_4_ = auVar220._16_4_ * fVar190;
    fVar191 = auVar38._20_4_;
    auVar47._20_4_ = auVar220._20_4_ * fVar191;
    fVar192 = auVar38._24_4_;
    auVar47._24_4_ = auVar220._24_4_ * fVar192;
    auVar47._28_4_ = auVar124._28_4_;
    auVar35 = vsubps_avx(auVar252,auVar47);
    fVar116 = fVar116 + fVar116 * auVar35._0_4_;
    fVar181 = fVar181 + fVar181 * auVar35._4_4_;
    fVar188 = fVar188 + fVar188 * auVar35._8_4_;
    fVar189 = fVar189 + fVar189 * auVar35._12_4_;
    fVar190 = fVar190 + fVar190 * auVar35._16_4_;
    fVar191 = fVar191 + fVar191 * auVar35._20_4_;
    fVar192 = fVar192 + fVar192 * auVar35._24_4_;
    auVar48._4_4_ = auVar220._4_4_ * fVar253;
    auVar48._0_4_ = auVar220._0_4_ * fVar128;
    auVar48._8_4_ = auVar220._8_4_ * fVar258;
    auVar48._12_4_ = auVar220._12_4_ * fVar243;
    auVar48._16_4_ = auVar220._16_4_ * fVar18;
    auVar48._20_4_ = auVar220._20_4_ * fVar23;
    auVar48._24_4_ = auVar220._24_4_ * fVar28;
    auVar48._28_4_ = auVar35._28_4_;
    auVar49._4_4_ = local_240 * fVar230;
    auVar49._0_4_ = local_240 * fVar226;
    auVar49._8_4_ = local_240 * fVar231;
    auVar49._12_4_ = local_240 * fVar232;
    auVar49._16_4_ = local_240 * fVar233;
    auVar49._20_4_ = local_240 * fVar234;
    auVar49._24_4_ = local_240 * fVar235;
    auVar49._28_4_ = auVar32._28_4_;
    auVar124 = vsubps_avx(auVar48,auVar49);
    auVar50._4_4_ = auVar220._4_4_ * fVar140;
    auVar50._0_4_ = auVar220._0_4_ * fVar127;
    auVar50._8_4_ = auVar220._8_4_ * fVar210;
    auVar50._12_4_ = auVar220._12_4_ * fVar211;
    auVar50._16_4_ = auVar220._16_4_ * fVar212;
    auVar50._20_4_ = auVar220._20_4_ * fVar213;
    auVar50._24_4_ = auVar220._24_4_ * fVar214;
    auVar50._28_4_ = auVar32._28_4_;
    auVar51._4_4_ = fVar250 * fVar230;
    auVar51._0_4_ = fVar250 * fVar226;
    auVar51._8_4_ = fVar250 * fVar231;
    auVar51._12_4_ = fVar250 * fVar232;
    auVar51._16_4_ = fVar250 * fVar233;
    auVar51._20_4_ = fVar250 * fVar234;
    uVar94 = auVar37._28_4_;
    auVar51._24_4_ = fVar250 * fVar235;
    auVar51._28_4_ = uVar94;
    auVar32 = vsubps_avx(auVar50,auVar51);
    auVar52._4_4_ = auVar220._4_4_ * fVar139;
    auVar52._0_4_ = auVar220._0_4_ * fVar216;
    auVar52._8_4_ = auVar220._8_4_ * fVar221;
    auVar52._12_4_ = auVar220._12_4_ * fVar222;
    auVar52._16_4_ = auVar220._16_4_ * fVar223;
    auVar52._20_4_ = auVar220._20_4_ * fVar224;
    auVar52._24_4_ = auVar220._24_4_ * fVar225;
    auVar52._28_4_ = uVar94;
    auVar53._4_4_ = fVar194 * fVar230;
    auVar53._0_4_ = fVar194 * fVar226;
    auVar53._8_4_ = fVar194 * fVar231;
    auVar53._12_4_ = fVar194 * fVar232;
    auVar53._16_4_ = fVar194 * fVar233;
    auVar53._20_4_ = fVar194 * fVar234;
    auVar53._24_4_ = fVar194 * fVar235;
    auVar53._28_4_ = local_440._28_4_;
    auVar37 = vsubps_avx(auVar52,auVar53);
    auVar120._0_4_ =
         auVar124._0_4_ * auVar124._0_4_ +
         auVar32._0_4_ * auVar32._0_4_ + auVar37._0_4_ * auVar37._0_4_;
    auVar120._4_4_ =
         auVar124._4_4_ * auVar124._4_4_ +
         auVar32._4_4_ * auVar32._4_4_ + auVar37._4_4_ * auVar37._4_4_;
    auVar120._8_4_ =
         auVar124._8_4_ * auVar124._8_4_ +
         auVar32._8_4_ * auVar32._8_4_ + auVar37._8_4_ * auVar37._8_4_;
    auVar120._12_4_ =
         auVar124._12_4_ * auVar124._12_4_ +
         auVar32._12_4_ * auVar32._12_4_ + auVar37._12_4_ * auVar37._12_4_;
    auVar120._16_4_ =
         auVar124._16_4_ * auVar124._16_4_ +
         auVar32._16_4_ * auVar32._16_4_ + auVar37._16_4_ * auVar37._16_4_;
    auVar120._20_4_ =
         auVar124._20_4_ * auVar124._20_4_ +
         auVar32._20_4_ * auVar32._20_4_ + auVar37._20_4_ * auVar37._20_4_;
    auVar120._24_4_ =
         auVar124._24_4_ * auVar124._24_4_ +
         auVar32._24_4_ * auVar32._24_4_ + auVar37._24_4_ * auVar37._24_4_;
    auVar120._28_4_ = auVar124._28_4_ + auVar32._28_4_ + auVar37._28_4_;
    auVar54._4_4_ = fVar150 * fVar150 * fVar152;
    auVar54._0_4_ = fVar145 * fVar145 * fVar147;
    auVar54._8_4_ = fVar153 * fVar153 * fVar155;
    auVar54._12_4_ = fVar156 * fVar156 * fVar158;
    auVar54._16_4_ = fVar159 * fVar159 * fVar161;
    auVar54._20_4_ = fVar162 * fVar162 * fVar164;
    auVar54._24_4_ = fVar165 * fVar165 * fVar167;
    auVar54._28_4_ = uStack_5e8._4_4_;
    auVar124 = vcmpps_avx(auVar120,auVar54,1);
    auVar55._4_4_ = fVar181 * -fVar230;
    auVar55._0_4_ = fVar116 * -fVar226;
    auVar55._8_4_ = fVar188 * -fVar231;
    auVar55._12_4_ = fVar189 * -fVar232;
    auVar55._16_4_ = fVar190 * -fVar233;
    auVar55._20_4_ = fVar191 * -fVar234;
    auVar55._24_4_ = fVar192 * -fVar235;
    auVar55._28_4_ = -fVar236;
    auVar32 = vblendvps_avx(auVar248,auVar55,auVar124);
    auVar133._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->leftExists & 0xfffffff0));
    auVar133._0_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + ((line->leftExists & 0xf) << 4));
    auVar124 = vandnps_avx(auVar133,auVar34);
    auVar33 = vblendvps_avx(auVar248,auVar32,auVar124);
    auVar121._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->rightExists & 0xfffffff0));
    auVar121._0_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + ((line->rightExists & 0xf) << 4));
    auVar56._4_4_ = auVar220._4_4_ * auVar41._4_4_;
    auVar56._0_4_ = auVar220._0_4_ * auVar41._0_4_;
    auVar56._8_4_ = auVar220._8_4_ * auVar41._8_4_;
    auVar56._12_4_ = auVar220._12_4_ * auVar41._12_4_;
    auVar56._16_4_ = auVar220._16_4_ * auVar41._16_4_;
    auVar56._20_4_ = auVar220._20_4_ * auVar41._20_4_;
    auVar56._24_4_ = auVar220._24_4_ * auVar41._24_4_;
    auVar56._28_4_ = auVar124._28_4_;
    auVar57._4_4_ = auVar220._4_4_ * auVar42._4_4_;
    auVar57._0_4_ = auVar220._0_4_ * auVar42._0_4_;
    auVar57._8_4_ = auVar220._8_4_ * auVar42._8_4_;
    auVar57._12_4_ = auVar220._12_4_ * auVar42._12_4_;
    auVar57._16_4_ = auVar220._16_4_ * auVar42._16_4_;
    auVar57._20_4_ = auVar220._20_4_ * auVar42._20_4_;
    auVar57._24_4_ = auVar220._24_4_ * auVar42._24_4_;
    auVar57._28_4_ = auVar37._28_4_;
    auVar58._4_4_ = auVar220._4_4_ * auVar43._4_4_;
    auVar58._0_4_ = auVar220._0_4_ * auVar43._0_4_;
    auVar58._8_4_ = auVar220._8_4_ * auVar43._8_4_;
    auVar58._12_4_ = auVar220._12_4_ * auVar43._12_4_;
    auVar58._16_4_ = auVar220._16_4_ * auVar43._16_4_;
    auVar58._20_4_ = auVar220._20_4_ * auVar43._20_4_;
    auVar58._24_4_ = auVar220._24_4_ * auVar43._24_4_;
    auVar58._28_4_ = 0;
    auVar59._4_4_ = local_240 * fVar202;
    auVar59._0_4_ = local_240 * fVar193;
    auVar59._8_4_ = local_240 * fVar203;
    auVar59._12_4_ = local_240 * fVar204;
    auVar59._16_4_ = local_240 * fVar205;
    auVar59._20_4_ = local_240 * fVar206;
    auVar59._24_4_ = local_240 * fVar207;
    auVar59._28_4_ = uVar94;
    auVar124 = vsubps_avx(auVar56,auVar59);
    auVar60._4_4_ = fVar250 * fVar202;
    auVar60._0_4_ = fVar250 * fVar193;
    auVar60._8_4_ = fVar250 * fVar203;
    auVar60._12_4_ = fVar250 * fVar204;
    auVar60._16_4_ = fVar250 * fVar205;
    auVar60._20_4_ = fVar250 * fVar206;
    auVar60._24_4_ = fVar250 * fVar207;
    auVar60._28_4_ = uVar94;
    auVar32 = vsubps_avx(auVar57,auVar60);
    auVar61._4_4_ = fVar194 * fVar202;
    auVar61._0_4_ = fVar194 * fVar193;
    auVar61._8_4_ = fVar194 * fVar203;
    auVar61._12_4_ = fVar194 * fVar204;
    auVar61._16_4_ = fVar194 * fVar205;
    auVar61._20_4_ = fVar194 * fVar206;
    auVar61._24_4_ = fVar194 * fVar207;
    auVar61._28_4_ = uVar94;
    auVar37 = vsubps_avx(auVar58,auVar61);
    auVar103._0_4_ =
         auVar124._0_4_ * auVar124._0_4_ +
         auVar32._0_4_ * auVar32._0_4_ + auVar37._0_4_ * auVar37._0_4_;
    auVar103._4_4_ =
         auVar124._4_4_ * auVar124._4_4_ +
         auVar32._4_4_ * auVar32._4_4_ + auVar37._4_4_ * auVar37._4_4_;
    auVar103._8_4_ =
         auVar124._8_4_ * auVar124._8_4_ +
         auVar32._8_4_ * auVar32._8_4_ + auVar37._8_4_ * auVar37._8_4_;
    auVar103._12_4_ =
         auVar124._12_4_ * auVar124._12_4_ +
         auVar32._12_4_ * auVar32._12_4_ + auVar37._12_4_ * auVar37._12_4_;
    auVar103._16_4_ =
         auVar124._16_4_ * auVar124._16_4_ +
         auVar32._16_4_ * auVar32._16_4_ + auVar37._16_4_ * auVar37._16_4_;
    auVar103._20_4_ =
         auVar124._20_4_ * auVar124._20_4_ +
         auVar32._20_4_ * auVar32._20_4_ + auVar37._20_4_ * auVar37._20_4_;
    auVar103._24_4_ =
         auVar124._24_4_ * auVar124._24_4_ +
         auVar32._24_4_ * auVar32._24_4_ + auVar37._24_4_ * auVar37._24_4_;
    auVar103._28_4_ = auVar124._28_4_ + auVar32._28_4_ + auVar37._28_4_;
    auVar62._4_4_ = auVar99._4_4_ * auVar99._4_4_ * fVar152;
    auVar62._0_4_ = auVar99._0_4_ * auVar99._0_4_ * fVar147;
    auVar62._8_4_ = auVar99._8_4_ * auVar99._8_4_ * fVar155;
    auVar62._12_4_ = auVar99._12_4_ * auVar99._12_4_ * fVar158;
    auVar62._16_4_ = auVar100._16_4_ * auVar100._16_4_ * fVar161;
    auVar62._20_4_ = auVar100._20_4_ * auVar100._20_4_ * fVar164;
    auVar62._24_4_ = auVar100._24_4_ * auVar100._24_4_ * fVar167;
    auVar62._28_4_ = auVar100._28_4_;
    auVar32 = vcmpps_avx(auVar103,auVar62,1);
    auVar30 = vshufps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x60)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0);
    auVar124 = vandnps_avx(auVar121,auVar34);
    auVar63._4_4_ = fVar181 * -fVar202;
    auVar63._0_4_ = fVar116 * -fVar193;
    auVar63._8_4_ = fVar188 * -fVar203;
    auVar63._12_4_ = fVar189 * -fVar204;
    auVar63._16_4_ = fVar190 * -fVar205;
    auVar63._20_4_ = fVar191 * -fVar206;
    auVar63._24_4_ = fVar192 * -fVar207;
    auVar63._28_4_ = auVar38._28_4_ + auVar35._28_4_;
    auVar32 = vblendvps_avx(auVar248,auVar63,auVar32);
    auVar124 = vblendvps_avx(auVar248,auVar32,auVar124);
    auVar37 = vmaxps_avx(auVar33,auVar124);
    auVar32 = vcmpps_avx(auVar248,auVar37,0);
    auVar184._8_4_ = 0xff800000;
    auVar184._0_8_ = 0xff800000ff800000;
    auVar184._12_4_ = 0xff800000;
    auVar184._16_4_ = 0xff800000;
    auVar184._20_4_ = 0xff800000;
    auVar184._24_4_ = 0xff800000;
    auVar184._28_4_ = 0xff800000;
    auVar32 = vblendvps_avx(auVar37,auVar184,auVar32);
    auVar37 = vminps_avx(auVar33,auVar124);
    auVar124 = vcmpps_avx(auVar248,auVar37,0);
    auVar124 = vblendvps_avx(auVar37,auVar184,auVar124);
    auVar38 = vminps_avx(_local_640,auVar37);
    auVar37 = vcmpps_avx(auVar38,auVar37,0);
    auVar32 = vblendvps_avx(auVar124,auVar32,auVar37);
    auVar122._16_16_ = auVar30;
    auVar122._0_16_ = auVar30;
    auVar143._0_4_ = local_4e0 + auVar38._0_4_;
    auVar143._4_4_ = fStack_4dc + auVar38._4_4_;
    auVar143._8_4_ = fStack_4d8 + auVar38._8_4_;
    auVar143._12_4_ = fStack_4d4 + auVar38._12_4_;
    auVar143._16_4_ = fStack_4d0 + auVar38._16_4_;
    auVar143._20_4_ = fStack_4cc + auVar38._20_4_;
    auVar143._24_4_ = fStack_4c8 + auVar38._24_4_;
    auVar143._28_4_ = fStack_4c4 + auVar38._28_4_;
    auVar124 = vcmpps_avx(auVar122,auVar143,2);
    auVar30 = vshufps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x100)),0);
    auVar134._16_16_ = auVar30;
    auVar134._0_16_ = auVar30;
    auVar37 = vcmpps_avx(auVar143,auVar134,2);
    auVar124 = vandps_avx(auVar37,auVar124);
    local_3a0 = vmaxps_avx(local_420,auVar32);
    auVar32 = vcmpps_avx(auVar248,auVar38,4);
    auVar32 = vandps_avx(auVar32,auVar34);
    local_460 = vandps_avx(auVar124,auVar32);
    local_600._0_4_ = local_4e0 + local_3a0._0_4_;
    local_600._4_4_ = fStack_4dc + local_3a0._4_4_;
    fStack_5f8 = fStack_4d8 + local_3a0._8_4_;
    fStack_5f4 = fStack_4d4 + local_3a0._12_4_;
    uStack_5f0._0_4_ = fStack_4d0 + local_3a0._16_4_;
    uStack_5f0._4_4_ = fStack_4cc + local_3a0._20_4_;
    uStack_5e8._0_4_ = fStack_4c8 + local_3a0._24_4_;
    uStack_5e8._4_4_ = fStack_4c4 + local_3a0._28_4_;
    auVar124 = vcmpps_avx(auVar122,_local_600,2);
    auVar32 = vcmpps_avx(_local_600,auVar134,2);
    auVar124 = vandps_avx(auVar32,auVar124);
    auVar32 = vcmpps_avx(local_3a0,auVar184,4);
    auVar32 = vandps_avx(auVar32,auVar34);
    local_360 = vandps_avx(auVar124,auVar32);
    local_560 = vorps_avx(local_460,local_360);
    if ((((((((local_560 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_560 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_560 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_560 >> 0x7f,0) != '\0') ||
          (local_560 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_560 >> 0xbf,0) != '\0') ||
        (local_560 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_560[0x1f] < '\0') {
      auVar37 = vblendvps_avx(local_3a0,auVar38,local_460);
      auVar38 = vblendvps_avx(_local_380,auVar173,local_460);
      auVar87._4_4_ = fVar151;
      auVar87._0_4_ = fVar146;
      auVar87._8_4_ = fVar154;
      auVar87._12_4_ = fVar157;
      auVar87._16_4_ = fVar160;
      auVar87._20_4_ = fVar163;
      auVar87._24_4_ = fVar166;
      auVar87._28_4_ = fVar168;
      auVar124 = vrcpps_avx(auVar87);
      local_520 = auVar124._0_4_;
      fStack_51c = auVar124._4_4_;
      auVar64._4_4_ = fVar151 * fStack_51c;
      auVar64._0_4_ = fVar146 * local_520;
      fStack_518 = auVar124._8_4_;
      auVar64._8_4_ = fVar154 * fStack_518;
      fStack_514 = auVar124._12_4_;
      auVar64._12_4_ = fVar157 * fStack_514;
      fStack_510 = auVar124._16_4_;
      auVar64._16_4_ = fVar160 * fStack_510;
      fStack_50c = auVar124._20_4_;
      auVar64._20_4_ = fVar163 * fStack_50c;
      fStack_508 = auVar124._24_4_;
      auVar64._24_4_ = fVar166 * fStack_508;
      auVar64._28_4_ = local_460._28_4_;
      auVar238._8_4_ = 0x3f800000;
      auVar238._0_8_ = &DAT_3f8000003f800000;
      auVar238._12_4_ = 0x3f800000;
      auVar238._16_4_ = 0x3f800000;
      auVar238._20_4_ = 0x3f800000;
      auVar238._24_4_ = 0x3f800000;
      auVar238._28_4_ = 0x3f800000;
      auVar32 = vsubps_avx(auVar238,auVar64);
      local_520 = local_520 + local_520 * auVar32._0_4_;
      fStack_51c = fStack_51c + fStack_51c * auVar32._4_4_;
      fStack_518 = fStack_518 + fStack_518 * auVar32._8_4_;
      fStack_514 = fStack_514 + fStack_514 * auVar32._12_4_;
      fStack_510 = fStack_510 + fStack_510 * auVar32._16_4_;
      fStack_50c = fStack_50c + fStack_50c * auVar32._20_4_;
      fStack_508 = fStack_508 + fStack_508 * auVar32._24_4_;
      fStack_504 = auVar124._28_4_ + auVar32._28_4_;
      fVar145 = fVar146 * fVar135 * fVar145;
      fVar150 = fVar151 * fVar254 * fVar150;
      fVar153 = fVar154 * fVar237 * fVar153;
      fVar156 = fVar157 * fVar244 * fVar156;
      fVar159 = fVar160 * fVar19 * fVar159;
      fVar162 = fVar163 * fVar24 * fVar162;
      fVar165 = fVar166 * fVar29 * fVar165;
      local_500 = fVar109 * fVar145;
      fStack_4fc = fVar138 * fVar150;
      fStack_4f8 = fVar257 * fVar153;
      fStack_4f4 = fVar242 * fVar156;
      fStack_4f0 = fVar17 * fVar159;
      fStack_4ec = fVar22 * fVar162;
      fStack_4e8 = fVar27 * fVar165;
      auVar124 = vcmpps_avx(_local_640,auVar37,0);
      auVar32 = vcmpps_avx(auVar37,local_420,0);
      auVar124 = vorps_avx(auVar124,auVar32);
      auVar124 = vandps_avx(auVar124,auVar34);
      auVar41 = vcmpps_avx(auVar37,auVar33,0);
      auVar32 = vandps_avx(auVar41,auVar34);
      fVar135 = auVar37._0_4_;
      fVar254 = auVar37._4_4_;
      fVar237 = auVar37._8_4_;
      fVar244 = auVar37._12_4_;
      fVar19 = auVar37._16_4_;
      fVar24 = auVar37._20_4_;
      fVar29 = auVar37._24_4_;
      auVar123._0_4_ = local_500 + fVar169 * (local_240 * fVar135 + fVar128);
      auVar123._4_4_ = fStack_4fc + fVar175 * (local_240 * fVar254 + fVar253);
      auVar123._8_4_ = fStack_4f8 + fVar176 * (local_240 * fVar237 + fVar258);
      auVar123._12_4_ = fStack_4f4 + fVar177 * (local_240 * fVar244 + fVar243);
      auVar123._16_4_ = fStack_4f0 + fVar178 * (local_240 * fVar19 + fVar18);
      auVar123._20_4_ = fStack_4ec + fVar179 * (local_240 * fVar24 + fVar23);
      auVar123._24_4_ = fStack_4e8 + fVar180 * (local_240 * fVar29 + fVar28);
      auVar123._28_4_ = fVar250 + auVar41._28_4_ + local_440._28_4_;
      fStack_3dc = fVar138 * fStack_3bc;
      local_3e0 = fVar109 * local_3c0;
      fStack_3d8 = fVar257 * fStack_3b8;
      fStack_3d4 = fVar242 * fStack_3b4;
      fStack_3d0 = fVar17 * fStack_3b0;
      fStack_3cc = fVar22 * fStack_3ac;
      fStack_3c8 = fVar27 * fStack_3a8;
      fStack_3c4 = local_3a0._28_4_;
      fVar128 = auVar38._0_4_;
      fVar253 = auVar38._4_4_;
      auVar65._4_4_ = fVar138 * fStack_3bc * fVar253;
      auVar65._0_4_ = fVar109 * local_3c0 * fVar128;
      fVar109 = auVar38._8_4_;
      auVar65._8_4_ = fVar257 * fStack_3b8 * fVar109;
      fVar138 = auVar38._12_4_;
      auVar65._12_4_ = fVar242 * fStack_3b4 * fVar138;
      fVar258 = auVar38._16_4_;
      auVar65._16_4_ = fVar17 * fStack_3b0 * fVar258;
      fVar243 = auVar38._20_4_;
      auVar65._20_4_ = fVar22 * fStack_3ac * fVar243;
      fVar18 = auVar38._24_4_;
      auVar65._24_4_ = fVar27 * fStack_3a8 * fVar18;
      auVar65._28_4_ = auVar34._28_4_;
      auVar41 = vsubps_avx(auVar123,auVar65);
      fStack_53c = fVar137 * fVar150;
      local_540 = fVar199 * fVar145;
      fStack_538 = fVar256 * fVar153;
      fStack_534 = fVar241 * fVar156;
      fStack_530 = fVar16 * fVar159;
      fStack_52c = fVar21 * fVar162;
      fStack_528 = fVar26 * fVar165;
      fStack_524 = 1.0;
      auVar144._0_4_ = fVar199 * fVar145 + fVar169 * (fVar250 * fVar135 + fVar127);
      auVar144._4_4_ = fVar137 * fVar150 + fVar175 * (fVar250 * fVar254 + fVar140);
      auVar144._8_4_ = fVar256 * fVar153 + fVar176 * (fVar250 * fVar237 + fVar210);
      auVar144._12_4_ = fVar241 * fVar156 + fVar177 * (fVar250 * fVar244 + fVar211);
      auVar144._16_4_ = fVar16 * fVar159 + fVar178 * (fVar250 * fVar19 + fVar212);
      auVar144._20_4_ = fVar21 * fVar162 + fVar179 * (fVar250 * fVar24 + fVar213);
      auVar144._24_4_ = fVar26 * fVar165 + fVar180 * (fVar250 * fVar29 + fVar214);
      auVar144._28_4_ = auVar34._28_4_ + fVar215 + 1.0;
      fStack_3fc = fVar137 * fStack_3bc;
      local_400 = fVar199 * local_3c0;
      fStack_3f8 = fVar256 * fStack_3b8;
      fStack_3f4 = fVar241 * fStack_3b4;
      fStack_3f0 = fVar16 * fStack_3b0;
      fStack_3ec = fVar21 * fStack_3ac;
      fStack_3e8 = fVar26 * fStack_3a8;
      fStack_3e4 = local_240;
      auVar66._4_4_ = fVar137 * fStack_3bc * fVar253;
      auVar66._0_4_ = fVar199 * local_3c0 * fVar128;
      auVar66._8_4_ = fVar256 * fStack_3b8 * fVar109;
      auVar66._12_4_ = fVar241 * fStack_3b4 * fVar138;
      auVar66._16_4_ = fVar16 * fStack_3b0 * fVar258;
      auVar66._20_4_ = fVar21 * fStack_3ac * fVar243;
      auVar66._24_4_ = fVar26 * fStack_3a8 * fVar18;
      auVar66._28_4_ = fVar250;
      auVar42 = vsubps_avx(auVar144,auVar66);
      local_c0._0_8_ = local_5c0 ^ 0x8000000080000000;
      local_c0._8_4_ = -fVar257;
      local_c0._12_4_ = -fVar242;
      local_c0._16_4_ = -fVar17;
      local_c0._20_4_ = -fVar22;
      local_c0._24_4_ = -fVar27;
      local_c0._28_4_ = local_5c0._28_4_ ^ 0x80000000;
      auVar34 = vblendvps_avx(_local_5c0,local_c0,auVar32);
      local_2c0 = vblendvps_avx(auVar34,auVar41,auVar124);
      auVar201 = ZEXT3264(local_4a0);
      fStack_64 = auVar34._28_4_;
      local_3c0 = fVar198 * local_3c0;
      fStack_3bc = fVar136 * fStack_3bc;
      fStack_3b8 = fVar255 * fStack_3b8;
      fStack_3b4 = fVar240 * fStack_3b4;
      fStack_3b0 = fVar245 * fStack_3b0;
      fStack_3ac = fVar20 * fStack_3ac;
      fStack_3a8 = fVar25 * fStack_3a8;
      local_80 = fVar198 * fVar145;
      fStack_7c = fVar136 * fVar150;
      fStack_78 = fVar255 * fVar153;
      fStack_74 = fVar240 * fVar156;
      fStack_70 = fVar245 * fVar159;
      fStack_6c = fVar20 * fVar162;
      fStack_68 = fVar25 * fVar165;
      auVar185._0_4_ = fVar198 * fVar145 + fVar169 * (fVar216 + fVar194 * fVar135);
      auVar185._4_4_ = fVar136 * fVar150 + fVar175 * (fVar139 + fVar194 * fVar254);
      auVar185._8_4_ = fVar255 * fVar153 + fVar176 * (fVar221 + fVar194 * fVar237);
      auVar185._12_4_ = fVar240 * fVar156 + fVar177 * (fVar222 + fVar194 * fVar244);
      auVar185._16_4_ = fVar245 * fVar159 + fVar178 * (fVar223 + fVar194 * fVar19);
      auVar185._20_4_ = fVar20 * fVar162 + fVar179 * (fVar224 + fVar194 * fVar24);
      auVar185._24_4_ = fVar25 * fVar165 + fVar180 * (fVar225 + fVar194 * fVar29);
      auVar185._28_4_ = fStack_64 + fStack_4a4 + -INFINITY;
      auVar67._4_4_ = fStack_3bc * fVar253;
      auVar67._0_4_ = local_3c0 * fVar128;
      auVar67._8_4_ = fStack_3b8 * fVar109;
      auVar67._12_4_ = fStack_3b4 * fVar138;
      auVar67._16_4_ = fStack_3b0 * fVar258;
      auVar67._20_4_ = fStack_3ac * fVar243;
      auVar67._24_4_ = fStack_3a8 * fVar18;
      auVar67._28_4_ = fStack_64;
      local_e0._0_8_ = local_480._0_8_ ^ 0x8000000080000000;
      local_e0._8_4_ = -fVar256;
      local_e0._12_4_ = -fVar241;
      local_e0._16_4_ = -fVar16;
      local_e0._20_4_ = -fVar21;
      local_e0._24_4_ = -fVar26;
      local_e0._28_4_ = -fVar44;
      auVar34 = vblendvps_avx(local_480,local_e0,auVar32);
      auVar41 = vsubps_avx(auVar185,auVar67);
      local_2a0 = vblendvps_avx(auVar34,auVar42,auVar124);
      local_100._0_8_ = local_4a0._0_8_ ^ 0x8000000080000000;
      local_100._8_4_ = -fVar255;
      local_100._12_4_ = -fVar240;
      local_100._16_4_ = -fVar245;
      local_100._20_4_ = -fVar20;
      local_100._24_4_ = -fVar25;
      local_100._28_4_ = local_4a0._28_4_ ^ 0x80000000;
      auVar34 = vblendvps_avx(local_4a0,local_100,auVar32);
      local_280 = vblendvps_avx(auVar34,auVar41,auVar124);
      auVar104._8_4_ = 0x3f800000;
      auVar104._0_8_ = &DAT_3f8000003f800000;
      auVar104._12_4_ = 0x3f800000;
      auVar104._16_4_ = 0x3f800000;
      auVar104._20_4_ = 0x3f800000;
      auVar104._24_4_ = 0x3f800000;
      auVar104._28_4_ = 0x3f800000;
      local_a0 = vblendvps_avx(auVar104,ZEXT832(0) << 0x20,auVar32);
      auVar68._4_4_ = fVar253 * fStack_51c;
      auVar68._0_4_ = fVar128 * local_520;
      auVar68._8_4_ = fVar109 * fStack_518;
      auVar68._12_4_ = fVar138 * fStack_514;
      auVar68._16_4_ = fVar258 * fStack_510;
      auVar68._20_4_ = fVar243 * fStack_50c;
      auVar68._24_4_ = fVar18 * fStack_508;
      auVar68._28_4_ = auVar38._28_4_;
      local_320 = vblendvps_avx(local_a0,auVar68,auVar124);
      local_2e0._0_4_ = fVar135 + local_4e0;
      local_2e0._4_4_ = fVar254 + fStack_4dc;
      local_2e0._8_4_ = fVar237 + fStack_4d8;
      local_2e0._12_4_ = fVar244 + fStack_4d4;
      local_2e0._16_4_ = fVar19 + fStack_4d0;
      local_2e0._20_4_ = fVar24 + fStack_4cc;
      local_2e0._24_4_ = fVar29 + fStack_4c8;
      local_2e0._28_4_ = auVar37._28_4_ + fStack_4c4;
      local_300 = ZEXT832(0) << 0x20;
      uVar94 = vmovmskps_avx(local_560);
      uVar96 = CONCAT44((int)((ulong)lVar95 >> 0x20),uVar94);
      uVar88 = 1 << ((byte)k & 0x1f);
      uVar91 = (ulong)((uVar88 & 0xf) << 4);
      lVar93 = (long)((int)uVar88 >> 4) * 0x10;
      auVar239 = ZEXT864(0) << 0x20;
      auVar187 = ZEXT3264(local_480);
      auVar249 = ZEXT3264(_local_5c0);
      auVar229 = ZEXT3264(_local_600);
      fVar198 = fVar194;
      fVar199 = fVar194;
      fVar109 = fVar194;
      fVar128 = fVar194;
      fVar135 = fVar194;
      fVar136 = fVar194;
      fVar137 = fVar194;
      fVar138 = fStack_4a4;
      fVar253 = fVar250;
      fVar254 = fVar250;
      fVar255 = fVar250;
      fVar256 = fVar250;
      fVar257 = fVar250;
      fVar258 = fVar250;
      local_5c8 = line;
      fStack_4e4 = fVar250;
      uStack_3a4 = local_c0._28_4_;
      do {
        uVar15 = 0;
        if (uVar96 != 0) {
          for (; (uVar96 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
          }
        }
        uVar88 = *(uint *)(local_340 + uVar15 * 4);
        pGVar12 = (pSVar11->geometries).items[uVar88].ptr;
        local_670.ray = (RTCRayN *)ray;
        if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          uVar96 = uVar96 ^ 1L << (uVar15 & 0x3f);
          bVar97 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar97 = false;
        }
        else {
          local_4e0 = *(float *)(ray + k * 4 + 0x100);
          local_1c0 = *(undefined4 *)(local_320 + uVar15 * 4);
          local_1a0 = *(undefined4 *)(local_300 + uVar15 * 4);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2e0 + uVar15 * 4);
          local_670.context = context->user;
          local_150 = vpshufd_avx(ZEXT416(uVar88),0);
          uVar88 = (local_5c8->primIDs).field_0.i[uVar15];
          local_180._4_4_ = uVar88;
          local_180._0_4_ = uVar88;
          local_180._8_4_ = uVar88;
          local_180._12_4_ = uVar88;
          local_180._16_4_ = uVar88;
          local_180._20_4_ = uVar88;
          local_180._24_4_ = uVar88;
          local_180._28_4_ = uVar88;
          uVar94 = *(undefined4 *)(local_2c0 + uVar15 * 4);
          uVar2 = *(undefined4 *)(local_2a0 + uVar15 * 4);
          local_200._4_4_ = uVar2;
          local_200._0_4_ = uVar2;
          local_200._8_4_ = uVar2;
          local_200._12_4_ = uVar2;
          local_200._16_4_ = uVar2;
          local_200._20_4_ = uVar2;
          local_200._24_4_ = uVar2;
          local_200._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(local_280 + uVar15 * 4);
          local_1e0._4_4_ = uVar2;
          local_1e0._0_4_ = uVar2;
          local_1e0._8_4_ = uVar2;
          local_1e0._12_4_ = uVar2;
          local_1e0._16_4_ = uVar2;
          local_1e0._20_4_ = uVar2;
          local_1e0._24_4_ = uVar2;
          local_1e0._28_4_ = uVar2;
          local_220[0] = (RTCHitN)(char)uVar94;
          local_220[1] = (RTCHitN)(char)((uint)uVar94 >> 8);
          local_220[2] = (RTCHitN)(char)((uint)uVar94 >> 0x10);
          local_220[3] = (RTCHitN)(char)((uint)uVar94 >> 0x18);
          local_220[4] = (RTCHitN)(char)uVar94;
          local_220[5] = (RTCHitN)(char)((uint)uVar94 >> 8);
          local_220[6] = (RTCHitN)(char)((uint)uVar94 >> 0x10);
          local_220[7] = (RTCHitN)(char)((uint)uVar94 >> 0x18);
          local_220[8] = (RTCHitN)(char)uVar94;
          local_220[9] = (RTCHitN)(char)((uint)uVar94 >> 8);
          local_220[10] = (RTCHitN)(char)((uint)uVar94 >> 0x10);
          local_220[0xb] = (RTCHitN)(char)((uint)uVar94 >> 0x18);
          local_220[0xc] = (RTCHitN)(char)uVar94;
          local_220[0xd] = (RTCHitN)(char)((uint)uVar94 >> 8);
          local_220[0xe] = (RTCHitN)(char)((uint)uVar94 >> 0x10);
          local_220[0xf] = (RTCHitN)(char)((uint)uVar94 >> 0x18);
          local_220[0x10] = (RTCHitN)(char)uVar94;
          local_220[0x11] = (RTCHitN)(char)((uint)uVar94 >> 8);
          local_220[0x12] = (RTCHitN)(char)((uint)uVar94 >> 0x10);
          local_220[0x13] = (RTCHitN)(char)((uint)uVar94 >> 0x18);
          local_220[0x14] = (RTCHitN)(char)uVar94;
          local_220[0x15] = (RTCHitN)(char)((uint)uVar94 >> 8);
          local_220[0x16] = (RTCHitN)(char)((uint)uVar94 >> 0x10);
          local_220[0x17] = (RTCHitN)(char)((uint)uVar94 >> 0x18);
          local_220[0x18] = (RTCHitN)(char)uVar94;
          local_220[0x19] = (RTCHitN)(char)((uint)uVar94 >> 8);
          local_220[0x1a] = (RTCHitN)(char)((uint)uVar94 >> 0x10);
          local_220[0x1b] = (RTCHitN)(char)((uint)uVar94 >> 0x18);
          local_220[0x1c] = (RTCHitN)(char)uVar94;
          local_220[0x1d] = (RTCHitN)(char)((uint)uVar94 >> 8);
          local_220[0x1e] = (RTCHitN)(char)((uint)uVar94 >> 0x10);
          local_220[0x1f] = (RTCHitN)(char)((uint)uVar94 >> 0x18);
          uStack_1bc = local_1c0;
          uStack_1b8 = local_1c0;
          uStack_1b4 = local_1c0;
          uStack_1b0 = local_1c0;
          uStack_1ac = local_1c0;
          uStack_1a8 = local_1c0;
          uStack_1a4 = local_1c0;
          uStack_19c = local_1a0;
          uStack_198 = local_1a0;
          uStack_194 = local_1a0;
          uStack_190 = local_1a0;
          uStack_18c = local_1a0;
          uStack_188 = local_1a0;
          uStack_184 = local_1a0;
          local_160 = local_150;
          auVar124 = vcmpps_avx(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xf);
          uStack_13c = (local_670.context)->instID[0];
          local_140 = uStack_13c;
          uStack_138 = uStack_13c;
          uStack_134 = uStack_13c;
          uStack_130 = uStack_13c;
          uStack_12c = uStack_13c;
          uStack_128 = uStack_13c;
          uStack_124 = uStack_13c;
          uStack_11c = (local_670.context)->instPrimID[0];
          local_120 = uStack_11c;
          uStack_118 = uStack_11c;
          uStack_114 = uStack_11c;
          uStack_110 = uStack_11c;
          uStack_10c = uStack_11c;
          uStack_108 = uStack_11c;
          uStack_104 = uStack_11c;
          local_6a0 = *(undefined8 *)(mm_lookupmask_ps + uVar91);
          uStack_698 = *(undefined8 *)(mm_lookupmask_ps + uVar91 + 8);
          local_690 = *(undefined8 *)(mm_lookupmask_ps + lVar93);
          uStack_688 = *(undefined8 *)(mm_lookupmask_ps + lVar93 + 8);
          local_670.valid = (int *)&local_6a0;
          local_670.geometryUserPtr = pGVar12->userPtr;
          local_670.hit = local_220;
          local_670.N = 8;
          if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_560 = auVar124;
            (*pGVar12->occlusionFilterN)(&local_670);
            auVar239 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar229 = ZEXT3264(_local_600);
            auVar249 = ZEXT3264(_local_5c0);
            auVar201 = ZEXT3264(local_4a0);
            auVar187 = ZEXT3264(local_480);
            auVar124 = local_560;
            fVar194 = local_5a0;
            fVar198 = fStack_59c;
            fVar199 = fStack_598;
            fVar109 = fStack_594;
            fVar128 = fStack_590;
            fVar135 = fStack_58c;
            fVar136 = fStack_588;
            fVar137 = fStack_584;
            fVar127 = (float)local_620._0_4_;
            fVar140 = (float)local_620._4_4_;
            fVar210 = fStack_618;
            fVar211 = fStack_614;
            fVar212 = fStack_610;
            fVar213 = fStack_60c;
            fVar214 = fStack_608;
            fVar215 = fStack_604;
            fVar216 = (float)local_4c0._0_4_;
            fVar139 = (float)local_4c0._4_4_;
            fVar221 = fStack_4b8;
            fVar222 = fStack_4b4;
            fVar223 = fStack_4b0;
            fVar224 = fStack_4ac;
            fVar225 = fStack_4a8;
            fVar138 = fStack_4a4;
            fVar250 = local_580;
            fVar253 = fStack_57c;
            fVar254 = fStack_578;
            fVar255 = fStack_574;
            fVar256 = fStack_570;
            fVar257 = fStack_56c;
            fVar258 = fStack_568;
          }
          auVar30._8_8_ = uStack_698;
          auVar30._0_8_ = local_6a0;
          auVar30 = vpcmpeqd_avx(auVar239._0_16_,auVar30);
          auVar31._8_8_ = uStack_688;
          auVar31._0_8_ = local_690;
          auVar31 = vpcmpeqd_avx(auVar239._0_16_,auVar31);
          auVar105._16_16_ = auVar31;
          auVar105._0_16_ = auVar30;
          auVar32 = auVar124 & ~auVar105;
          if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar32 >> 0x7f,0) == '\0') &&
                (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar32 >> 0xbf,0) == '\0') &&
              (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar32[0x1f]) {
            auVar106._0_4_ = auVar30._0_4_ ^ auVar124._0_4_;
            auVar106._4_4_ = auVar30._4_4_ ^ auVar124._4_4_;
            auVar106._8_4_ = auVar30._8_4_ ^ auVar124._8_4_;
            auVar106._12_4_ = auVar30._12_4_ ^ auVar124._12_4_;
            auVar106._16_4_ = auVar31._0_4_ ^ auVar124._16_4_;
            auVar106._20_4_ = auVar31._4_4_ ^ auVar124._20_4_;
            auVar106._24_4_ = auVar31._8_4_ ^ auVar124._24_4_;
            auVar106._28_4_ = auVar31._12_4_ ^ auVar124._28_4_;
          }
          else {
            p_Var14 = context->args->filter;
            if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
              local_560 = auVar124;
              (*p_Var14)(&local_670);
              auVar239 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar229 = ZEXT3264(_local_600);
              auVar249 = ZEXT3264(_local_5c0);
              auVar201 = ZEXT3264(local_4a0);
              auVar187 = ZEXT3264(local_480);
              auVar124 = local_560;
              fVar194 = local_5a0;
              fVar198 = fStack_59c;
              fVar199 = fStack_598;
              fVar109 = fStack_594;
              fVar128 = fStack_590;
              fVar135 = fStack_58c;
              fVar136 = fStack_588;
              fVar137 = fStack_584;
              fVar127 = (float)local_620._0_4_;
              fVar140 = (float)local_620._4_4_;
              fVar210 = fStack_618;
              fVar211 = fStack_614;
              fVar212 = fStack_610;
              fVar213 = fStack_60c;
              fVar214 = fStack_608;
              fVar215 = fStack_604;
              fVar216 = (float)local_4c0._0_4_;
              fVar139 = (float)local_4c0._4_4_;
              fVar221 = fStack_4b8;
              fVar222 = fStack_4b4;
              fVar223 = fStack_4b0;
              fVar224 = fStack_4ac;
              fVar225 = fStack_4a8;
              fVar138 = fStack_4a4;
              fVar250 = local_580;
              fVar253 = fStack_57c;
              fVar254 = fStack_578;
              fVar255 = fStack_574;
              fVar256 = fStack_570;
              fVar257 = fStack_56c;
              fVar258 = fStack_568;
            }
            auVar117._8_8_ = uStack_698;
            auVar117._0_8_ = local_6a0;
            auVar30 = vpcmpeqd_avx(auVar239._0_16_,auVar117);
            auVar83._8_8_ = uStack_688;
            auVar83._0_8_ = local_690;
            auVar31 = vpcmpeqd_avx(auVar239._0_16_,auVar83);
            auVar113._16_16_ = auVar31;
            auVar113._0_16_ = auVar30;
            auVar106._0_4_ = auVar30._0_4_ ^ auVar124._0_4_;
            auVar106._4_4_ = auVar30._4_4_ ^ auVar124._4_4_;
            auVar106._8_4_ = auVar30._8_4_ ^ auVar124._8_4_;
            auVar106._12_4_ = auVar30._12_4_ ^ auVar124._12_4_;
            auVar106._16_4_ = auVar31._0_4_ ^ auVar124._16_4_;
            auVar106._20_4_ = auVar31._4_4_ ^ auVar124._20_4_;
            auVar106._24_4_ = auVar31._8_4_ ^ auVar124._24_4_;
            auVar106._28_4_ = auVar31._12_4_ ^ auVar124._28_4_;
            auVar125._8_4_ = 0xff800000;
            auVar125._0_8_ = 0xff800000ff800000;
            auVar125._12_4_ = 0xff800000;
            auVar125._16_4_ = 0xff800000;
            auVar125._20_4_ = 0xff800000;
            auVar125._24_4_ = 0xff800000;
            auVar125._28_4_ = 0xff800000;
            auVar124 = vblendvps_avx(auVar125,*(undefined1 (*) [32])(local_670.ray + 0x100),auVar113
                                    );
            *(undefined1 (*) [32])(local_670.ray + 0x100) = auVar124;
          }
          bVar78 = (auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar79 = (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar77 = (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar76 = SUB321(auVar106 >> 0x7f,0) == '\0';
          bVar75 = (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
          bVar74 = SUB321(auVar106 >> 0xbf,0) == '\0';
          bVar73 = (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
          bVar98 = -1 < auVar106[0x1f];
          bVar97 = ((((((bVar78 && bVar79) && bVar77) && bVar76) && bVar75) && bVar74) && bVar73) &&
                   bVar98;
          if (((((((bVar78 && bVar79) && bVar77) && bVar76) && bVar75) && bVar74) && bVar73) &&
              bVar98) {
            *(float *)(ray + k * 4 + 0x100) = local_4e0;
            uVar96 = uVar96 ^ 1L << (uVar15 & 0x3f);
          }
        }
      } while ((bVar97 != false) && (uVar96 != 0));
      auVar124 = vandps_avx(local_360,local_460);
      uVar94 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar114._4_4_ = uVar94;
      auVar114._0_4_ = uVar94;
      auVar114._8_4_ = uVar94;
      auVar114._12_4_ = uVar94;
      auVar114._16_4_ = uVar94;
      auVar114._20_4_ = uVar94;
      auVar114._24_4_ = uVar94;
      auVar114._28_4_ = uVar94;
      auVar32 = vcmpps_avx(auVar229._0_32_,auVar114,2);
      auVar34 = auVar124 & auVar32;
      if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar34 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar34 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar34 >> 0x7f,0) == '\0') &&
            (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar34 >> 0xbf,0) == '\0') &&
          (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar34[0x1f])
      {
        return (bool)(bVar97 ^ 1U);
      }
      auVar37 = vcmpps_avx(local_3a0,auVar33,0);
      auVar33 = vblendvps_avx(auVar249._0_32_,local_c0,auVar37);
      auVar34 = vblendvps_avx(auVar187._0_32_,local_e0,auVar37);
      auVar37 = vblendvps_avx(auVar201._0_32_,local_100,auVar37);
      auVar38 = vcmpps_avx(local_3a0,_local_640,0);
      auVar41 = vcmpps_avx(local_3a0,local_420,0);
      auVar38 = vorps_avx(auVar38,auVar41);
      fVar237 = local_3a0._0_4_;
      fVar240 = local_3a0._4_4_;
      fVar241 = local_3a0._8_4_;
      fVar242 = local_3a0._12_4_;
      fVar243 = local_3a0._16_4_;
      fVar244 = local_3a0._20_4_;
      fVar245 = local_3a0._24_4_;
      auVar174._0_4_ =
           (float)local_260._0_4_ * (fVar237 * local_240 + (float)local_440._0_4_) + local_500;
      auVar174._4_4_ =
           (float)local_260._4_4_ * (fVar240 * fStack_23c + (float)local_440._4_4_) + fStack_4fc;
      auVar174._8_4_ = fStack_258 * (fVar241 * fStack_238 + fStack_438) + fStack_4f8;
      auVar174._12_4_ = fStack_254 * (fVar242 * fStack_234 + fStack_434) + fStack_4f4;
      auVar174._16_4_ = fStack_250 * (fVar243 * fStack_230 + fStack_430) + fStack_4f0;
      auVar174._20_4_ = fStack_24c * (fVar244 * fStack_22c + fStack_42c) + fStack_4ec;
      auVar174._24_4_ = fStack_248 * (fVar245 * fStack_228 + fStack_428) + fStack_4e8;
      auVar174._28_4_ = auVar41._28_4_ + fStack_424 + fStack_4e4;
      auVar186._0_4_ = (float)local_260._0_4_ * (fVar127 + fVar250 * fVar237) + local_540;
      auVar186._4_4_ = (float)local_260._4_4_ * (fVar140 + fVar253 * fVar240) + fStack_53c;
      auVar186._8_4_ = fStack_258 * (fVar210 + fVar254 * fVar241) + fStack_538;
      auVar186._12_4_ = fStack_254 * (fVar211 + fVar255 * fVar242) + fStack_534;
      auVar186._16_4_ = fStack_250 * (fVar212 + fVar256 * fVar243) + fStack_530;
      auVar186._20_4_ = fStack_24c * (fVar213 + fVar257 * fVar244) + fStack_52c;
      auVar186._24_4_ = fStack_248 * (fVar214 + fVar258 * fVar245) + fStack_528;
      auVar186._28_4_ = fVar215 + auVar187._28_4_ + fStack_524;
      auVar197._0_4_ = (float)local_260._0_4_ * (fVar216 + fVar194 * fVar237) + local_80;
      auVar197._4_4_ = (float)local_260._4_4_ * (fVar139 + fVar198 * fVar240) + fStack_7c;
      auVar197._8_4_ = fStack_258 * (fVar221 + fVar199 * fVar241) + fStack_78;
      auVar197._12_4_ = fStack_254 * (fVar222 + fVar109 * fVar242) + fStack_74;
      auVar197._16_4_ = fStack_250 * (fVar223 + fVar128 * fVar243) + fStack_70;
      auVar197._20_4_ = fStack_24c * (fVar224 + fVar135 * fVar244) + fStack_6c;
      auVar197._24_4_ = fStack_248 * (fVar225 + fVar136 * fVar245) + fStack_68;
      auVar197._28_4_ = fVar138 + fVar137 + fStack_64;
      auVar69._4_4_ = (float)local_380._4_4_ * fStack_3dc;
      auVar69._0_4_ = (float)local_380._0_4_ * local_3e0;
      auVar69._8_4_ = fStack_378 * fStack_3d8;
      auVar69._12_4_ = fStack_374 * fStack_3d4;
      auVar69._16_4_ = fStack_370 * fStack_3d0;
      auVar69._20_4_ = fStack_36c * fStack_3cc;
      auVar69._24_4_ = fStack_368 * fStack_3c8;
      auVar69._28_4_ = uStack_244;
      auVar41 = vsubps_avx(auVar174,auVar69);
      auVar70._4_4_ = (float)local_380._4_4_ * fStack_3fc;
      auVar70._0_4_ = (float)local_380._0_4_ * local_400;
      auVar70._8_4_ = fStack_378 * fStack_3f8;
      auVar70._12_4_ = fStack_374 * fStack_3f4;
      auVar70._16_4_ = fStack_370 * fStack_3f0;
      auVar70._20_4_ = fStack_36c * fStack_3ec;
      auVar70._24_4_ = fStack_368 * fStack_3e8;
      auVar70._28_4_ = uStack_244;
      auVar42 = vsubps_avx(auVar186,auVar70);
      auVar71._4_4_ = (float)local_380._4_4_ * fStack_3bc;
      auVar71._0_4_ = (float)local_380._0_4_ * local_3c0;
      auVar71._8_4_ = fStack_378 * fStack_3b8;
      auVar71._12_4_ = fStack_374 * fStack_3b4;
      auVar71._16_4_ = fStack_370 * fStack_3b0;
      auVar71._20_4_ = fStack_36c * fStack_3ac;
      auVar71._24_4_ = fStack_368 * fStack_3a8;
      auVar71._28_4_ = uStack_244;
      auVar43 = vsubps_avx(auVar197,auVar71);
      local_2c0 = vblendvps_avx(auVar33,auVar41,auVar38);
      local_2a0 = vblendvps_avx(auVar34,auVar42,auVar38);
      local_280 = vblendvps_avx(auVar37,auVar43,auVar38);
      auVar72._4_4_ = (float)local_380._4_4_ * fStack_51c;
      auVar72._0_4_ = (float)local_380._0_4_ * local_520;
      auVar72._8_4_ = fStack_378 * fStack_518;
      auVar72._12_4_ = fStack_374 * fStack_514;
      auVar72._16_4_ = fStack_370 * fStack_510;
      auVar72._20_4_ = fStack_36c * fStack_50c;
      auVar72._24_4_ = fStack_368 * fStack_508;
      auVar72._28_4_ = auVar41._28_4_;
      local_320 = vblendvps_avx(local_a0,auVar72,auVar38);
      auVar124 = vandps_avx(auVar32,auVar124);
      auVar187 = ZEXT864(0) << 0x20;
      local_300 = ZEXT832(0) << 0x20;
      local_2e0 = auVar229._0_32_;
      uVar88 = 1 << ((byte)k & 0x1f);
      auVar92 = (undefined1  [8])context->scene;
      uVar90 = vmovmskps_avx(auVar124);
      uVar91 = (ulong)uVar90;
      uVar96 = (ulong)((uVar88 & 0xf) << 4);
      local_600 = (undefined1  [8])(mm_lookupmask_ps + (long)((int)uVar88 >> 4) * 0x10);
      auVar201 = ZEXT864(0) << 0x20;
      do {
        uVar15 = 0;
        if (uVar91 != 0) {
          for (; (uVar91 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
          }
        }
        uVar88 = *(uint *)(local_340 + uVar15 * 4);
        pGVar12 = (((Scene *)auVar92)->geometries).items[uVar88].ptr;
        if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          uVar91 = uVar91 ^ 1L << (uVar15 & 0x3f);
          bVar98 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar98 = false;
        }
        else {
          uVar94 = *(undefined4 *)(ray + k * 4 + 0x100);
          local_1c0 = *(undefined4 *)(local_320 + uVar15 * 4);
          local_1a0 = *(undefined4 *)(local_300 + uVar15 * 4);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2e0 + uVar15 * 4);
          local_670.context = context->user;
          local_150 = vpshufd_avx(ZEXT416(uVar88),0);
          uVar88 = (local_5c8->primIDs).field_0.i[uVar15];
          local_180._4_4_ = uVar88;
          local_180._0_4_ = uVar88;
          local_180._8_4_ = uVar88;
          local_180._12_4_ = uVar88;
          local_180._16_4_ = uVar88;
          local_180._20_4_ = uVar88;
          local_180._24_4_ = uVar88;
          local_180._28_4_ = uVar88;
          uVar2 = *(undefined4 *)(local_2c0 + uVar15 * 4);
          uVar3 = *(undefined4 *)(local_2a0 + uVar15 * 4);
          local_200._4_4_ = uVar3;
          local_200._0_4_ = uVar3;
          local_200._8_4_ = uVar3;
          local_200._12_4_ = uVar3;
          local_200._16_4_ = uVar3;
          local_200._20_4_ = uVar3;
          local_200._24_4_ = uVar3;
          local_200._28_4_ = uVar3;
          uVar3 = *(undefined4 *)(local_280 + uVar15 * 4);
          local_1e0._4_4_ = uVar3;
          local_1e0._0_4_ = uVar3;
          local_1e0._8_4_ = uVar3;
          local_1e0._12_4_ = uVar3;
          local_1e0._16_4_ = uVar3;
          local_1e0._20_4_ = uVar3;
          local_1e0._24_4_ = uVar3;
          local_1e0._28_4_ = uVar3;
          local_220[0] = (RTCHitN)(char)uVar2;
          local_220[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_220[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_220[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_220[4] = (RTCHitN)(char)uVar2;
          local_220[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_220[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_220[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_220[8] = (RTCHitN)(char)uVar2;
          local_220[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_220[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_220[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_220[0xc] = (RTCHitN)(char)uVar2;
          local_220[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_220[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_220[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_220[0x10] = (RTCHitN)(char)uVar2;
          local_220[0x11] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_220[0x12] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_220[0x13] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_220[0x14] = (RTCHitN)(char)uVar2;
          local_220[0x15] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_220[0x16] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_220[0x17] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_220[0x18] = (RTCHitN)(char)uVar2;
          local_220[0x19] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_220[0x1a] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_220[0x1b] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_220[0x1c] = (RTCHitN)(char)uVar2;
          local_220[0x1d] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_220[0x1e] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_220[0x1f] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          uStack_1bc = local_1c0;
          uStack_1b8 = local_1c0;
          uStack_1b4 = local_1c0;
          uStack_1b0 = local_1c0;
          uStack_1ac = local_1c0;
          uStack_1a8 = local_1c0;
          uStack_1a4 = local_1c0;
          uStack_19c = local_1a0;
          uStack_198 = local_1a0;
          uStack_194 = local_1a0;
          uStack_190 = local_1a0;
          uStack_18c = local_1a0;
          uStack_188 = local_1a0;
          uStack_184 = local_1a0;
          local_160 = local_150;
          _local_640 = vcmpps_avx(auVar187._0_32_,auVar187._0_32_,0xf);
          uStack_13c = (local_670.context)->instID[0];
          local_140 = uStack_13c;
          uStack_138 = uStack_13c;
          uStack_134 = uStack_13c;
          uStack_130 = uStack_13c;
          uStack_12c = uStack_13c;
          uStack_128 = uStack_13c;
          uStack_124 = uStack_13c;
          uStack_11c = (local_670.context)->instPrimID[0];
          local_120 = uStack_11c;
          uStack_118 = uStack_11c;
          uStack_114 = uStack_11c;
          uStack_110 = uStack_11c;
          uStack_10c = uStack_11c;
          uStack_108 = uStack_11c;
          uStack_104 = uStack_11c;
          local_6a0 = *(undefined8 *)(mm_lookupmask_ps + uVar96);
          uStack_698 = *(undefined8 *)(mm_lookupmask_ps + uVar96 + 8);
          local_690 = *(undefined8 *)local_600;
          uStack_688 = *(undefined8 *)((long)local_600 + 8);
          local_670.valid = (int *)&local_6a0;
          local_670.geometryUserPtr = pGVar12->userPtr;
          local_670.hit = local_220;
          local_670.N = 8;
          local_670.ray = (RTCRayN *)ray;
          if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_620 = auVar92;
            (*pGVar12->occlusionFilterN)(&local_670);
            auVar201 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar187 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar92 = local_620;
          }
          auVar81._8_8_ = uStack_698;
          auVar81._0_8_ = local_6a0;
          auVar30 = vpcmpeqd_avx(auVar201._0_16_,auVar81);
          auVar84._8_8_ = uStack_688;
          auVar84._0_8_ = local_690;
          auVar31 = vpcmpeqd_avx(auVar201._0_16_,auVar84);
          auVar107._16_16_ = auVar31;
          auVar107._0_16_ = auVar30;
          auVar124 = _local_640 & ~auVar107;
          if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar124 >> 0x7f,0) == '\0') &&
                (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar124 >> 0xbf,0) == '\0') &&
              (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar124[0x1f]) {
            auVar108._0_4_ = auVar30._0_4_ ^ local_640._0_4_;
            auVar108._4_4_ = auVar30._4_4_ ^ local_640._4_4_;
            auVar108._8_4_ = auVar30._8_4_ ^ local_640._8_4_;
            auVar108._12_4_ = auVar30._12_4_ ^ local_640._12_4_;
            auVar108._16_4_ = auVar31._0_4_ ^ local_640._16_4_;
            auVar108._20_4_ = auVar31._4_4_ ^ local_640._20_4_;
            auVar108._24_4_ = auVar31._8_4_ ^ local_640._24_4_;
            auVar108._28_4_ = auVar31._12_4_ ^ local_640._28_4_;
          }
          else {
            p_Var14 = context->args->filter;
            if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
              local_620 = auVar92;
              (*p_Var14)(&local_670);
              auVar201 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar187 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar92 = local_620;
            }
            auVar82._8_8_ = uStack_698;
            auVar82._0_8_ = local_6a0;
            auVar30 = vpcmpeqd_avx(auVar201._0_16_,auVar82);
            auVar85._8_8_ = uStack_688;
            auVar85._0_8_ = local_690;
            auVar31 = vpcmpeqd_avx(auVar201._0_16_,auVar85);
            auVar115._16_16_ = auVar31;
            auVar115._0_16_ = auVar30;
            auVar108._0_4_ = auVar30._0_4_ ^ local_640._0_4_;
            auVar108._4_4_ = auVar30._4_4_ ^ local_640._4_4_;
            auVar108._8_4_ = auVar30._8_4_ ^ local_640._8_4_;
            auVar108._12_4_ = auVar30._12_4_ ^ local_640._12_4_;
            auVar108._16_4_ = auVar31._0_4_ ^ local_640._16_4_;
            auVar108._20_4_ = auVar31._4_4_ ^ local_640._20_4_;
            auVar108._24_4_ = auVar31._8_4_ ^ local_640._24_4_;
            auVar108._28_4_ = auVar31._12_4_ ^ local_640._28_4_;
            auVar126._8_4_ = 0xff800000;
            auVar126._0_8_ = 0xff800000ff800000;
            auVar126._12_4_ = 0xff800000;
            auVar126._16_4_ = 0xff800000;
            auVar126._20_4_ = 0xff800000;
            auVar126._24_4_ = 0xff800000;
            auVar126._28_4_ = 0xff800000;
            auVar124 = vblendvps_avx(auVar126,*(undefined1 (*) [32])(local_670.ray + 0x100),auVar115
                                    );
            *(undefined1 (*) [32])(local_670.ray + 0x100) = auVar124;
          }
          bVar79 = (auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar80 = (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar78 = (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar77 = SUB321(auVar108 >> 0x7f,0) == '\0';
          bVar76 = (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
          bVar75 = SUB321(auVar108 >> 0xbf,0) == '\0';
          bVar74 = (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
          bVar73 = -1 < auVar108[0x1f];
          bVar98 = ((((((bVar79 && bVar80) && bVar78) && bVar77) && bVar76) && bVar75) && bVar74) &&
                   bVar73;
          if (((((((bVar79 && bVar80) && bVar78) && bVar77) && bVar76) && bVar75) && bVar74) &&
              bVar73) {
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar94;
            uVar91 = uVar91 ^ 1L << (uVar15 & 0x3f);
          }
        }
      } while ((bVar98 != false) && (uVar91 != 0));
      return (bool)(bVar97 ^ 1U | bVar98 ^ 1U);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom,ray.time()[k]);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }